

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  uint uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [28];
  undefined1 auVar108 [32];
  uint uVar109;
  int iVar110;
  ulong uVar111;
  uint uVar112;
  ulong uVar113;
  long lVar114;
  ulong uVar115;
  Geometry *geometry;
  long lVar116;
  bool bVar117;
  bool bVar118;
  undefined4 uVar119;
  undefined8 uVar120;
  float fVar136;
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar125 [32];
  undefined1 auVar122 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar135;
  float fVar137;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar123 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 extraout_var [56];
  float fVar152;
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar166 [32];
  undefined1 auVar159 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar176 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar213 [64];
  undefined4 uVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar223;
  undefined1 auVar220 [16];
  float fVar219;
  undefined8 uVar225;
  undefined1 auVar221 [32];
  undefined8 uVar224;
  undefined8 uVar226;
  undefined1 auVar222 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  float fVar229;
  float fVar231;
  undefined1 auVar230 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_96d;
  ulong local_960;
  ulong local_940;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 auStack_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  LinearSpace3fa *local_5f0;
  Primitive *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined4 local_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  int local_400;
  int local_3fc;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 local_3a0 [32];
  float local_380 [4];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar179 [64];
  
  PVar14 = prim[1];
  uVar111 = (ulong)(byte)PVar14;
  lVar24 = uVar111 * 0x25;
  fVar153 = *(float *)(prim + lVar24 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar20 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + lVar24 + 6));
  auVar121._0_4_ = fVar153 * auVar20._0_4_;
  auVar121._4_4_ = fVar153 * auVar20._4_4_;
  auVar121._8_4_ = fVar153 * auVar20._8_4_;
  auVar121._12_4_ = fVar153 * auVar20._12_4_;
  auVar154._0_4_ = fVar153 * auVar21._0_4_;
  auVar154._4_4_ = fVar153 * auVar21._4_4_;
  auVar154._8_4_ = fVar153 * auVar21._8_4_;
  auVar154._12_4_ = fVar153 * auVar21._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar111 * 4 + 6);
  auVar125 = vpmovsxbd_avx2(auVar20);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar111 * 5 + 6);
  auVar133 = vpmovsxbd_avx2(auVar21);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar111 * 6 + 6);
  auVar132 = vpmovsxbd_avx2(auVar7);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar111 * 0xf + 6);
  auVar147 = vpmovsxbd_avx2(auVar8);
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar221 = vpmovsxbd_avx2(auVar9);
  auVar221 = vcvtdq2ps_avx(auVar221);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar111 + 6);
  auVar22 = vpmovsxbd_avx2(auVar10);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar111 * 0x1a + 6);
  auVar203 = vpmovsxbd_avx2(auVar11);
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar111 * 0x1b + 6);
  auVar210 = vpmovsxbd_avx2(auVar12);
  auVar210 = vcvtdq2ps_avx(auVar210);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar111 * 0x1c + 6);
  auVar23 = vpmovsxbd_avx2(auVar13);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar216._4_4_ = auVar154._0_4_;
  auVar216._0_4_ = auVar154._0_4_;
  auVar216._8_4_ = auVar154._0_4_;
  auVar216._12_4_ = auVar154._0_4_;
  auVar216._16_4_ = auVar154._0_4_;
  auVar216._20_4_ = auVar154._0_4_;
  auVar216._24_4_ = auVar154._0_4_;
  auVar216._28_4_ = auVar154._0_4_;
  auVar20 = vmovshdup_avx(auVar154);
  uVar120 = auVar20._0_8_;
  auVar232._8_8_ = uVar120;
  auVar232._0_8_ = uVar120;
  auVar232._16_8_ = uVar120;
  auVar232._24_8_ = uVar120;
  auVar20 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar153 = auVar20._0_4_;
  auVar179._0_4_ = fVar153 * auVar132._0_4_;
  fVar152 = auVar20._4_4_;
  auVar179._4_4_ = fVar152 * auVar132._4_4_;
  auVar179._8_4_ = fVar153 * auVar132._8_4_;
  auVar179._12_4_ = fVar152 * auVar132._12_4_;
  auVar179._16_4_ = fVar153 * auVar132._16_4_;
  auVar179._20_4_ = fVar152 * auVar132._20_4_;
  auVar179._28_36_ = in_ZMM10._28_36_;
  auVar179._24_4_ = fVar153 * auVar132._24_4_;
  auVar171._0_4_ = auVar22._0_4_ * fVar153;
  auVar171._4_4_ = auVar22._4_4_ * fVar152;
  auVar171._8_4_ = auVar22._8_4_ * fVar153;
  auVar171._12_4_ = auVar22._12_4_ * fVar152;
  auVar171._16_4_ = auVar22._16_4_ * fVar153;
  auVar171._20_4_ = auVar22._20_4_ * fVar152;
  auVar171._28_36_ = in_ZMM9._28_36_;
  auVar171._24_4_ = auVar22._24_4_ * fVar153;
  auVar199._0_4_ = auVar23._0_4_ * fVar153;
  auVar199._4_4_ = auVar23._4_4_ * fVar152;
  auVar199._8_4_ = auVar23._8_4_ * fVar153;
  auVar199._12_4_ = auVar23._12_4_ * fVar152;
  auVar199._16_4_ = auVar23._16_4_ * fVar153;
  auVar199._20_4_ = auVar23._20_4_ * fVar152;
  auVar199._24_4_ = auVar23._24_4_ * fVar153;
  auVar199._28_4_ = 0;
  auVar20 = vfmadd231ps_fma(auVar179._0_32_,auVar232,auVar133);
  auVar21 = vfmadd231ps_fma(auVar171._0_32_,auVar232,auVar221);
  auVar7 = vfmadd231ps_fma(auVar199,auVar210,auVar232);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar216,auVar125);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar216,auVar147);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar203,auVar216);
  auVar230._4_4_ = auVar121._0_4_;
  auVar230._0_4_ = auVar121._0_4_;
  auVar230._8_4_ = auVar121._0_4_;
  auVar230._12_4_ = auVar121._0_4_;
  auVar230._16_4_ = auVar121._0_4_;
  auVar230._20_4_ = auVar121._0_4_;
  auVar230._24_4_ = auVar121._0_4_;
  auVar230._28_4_ = auVar121._0_4_;
  auVar20 = vmovshdup_avx(auVar121);
  uVar120 = auVar20._0_8_;
  auVar233._8_8_ = uVar120;
  auVar233._0_8_ = uVar120;
  auVar233._16_8_ = uVar120;
  auVar233._24_8_ = uVar120;
  auVar20 = vshufps_avx(auVar121,auVar121,0xaa);
  fVar153 = auVar20._0_4_;
  auVar126._0_4_ = fVar153 * auVar132._0_4_;
  fVar152 = auVar20._4_4_;
  auVar126._4_4_ = fVar152 * auVar132._4_4_;
  auVar126._8_4_ = fVar153 * auVar132._8_4_;
  auVar126._12_4_ = fVar152 * auVar132._12_4_;
  auVar126._16_4_ = fVar153 * auVar132._16_4_;
  auVar126._20_4_ = fVar152 * auVar132._20_4_;
  auVar126._24_4_ = fVar153 * auVar132._24_4_;
  auVar126._28_4_ = 0;
  auVar168._4_4_ = auVar22._4_4_ * fVar152;
  auVar168._0_4_ = auVar22._0_4_ * fVar153;
  auVar168._8_4_ = auVar22._8_4_ * fVar153;
  auVar168._12_4_ = auVar22._12_4_ * fVar152;
  auVar168._16_4_ = auVar22._16_4_ * fVar153;
  auVar168._20_4_ = auVar22._20_4_ * fVar152;
  auVar168._24_4_ = auVar22._24_4_ * fVar153;
  auVar168._28_4_ = auVar132._28_4_;
  auVar132._4_4_ = auVar23._4_4_ * fVar152;
  auVar132._0_4_ = auVar23._0_4_ * fVar153;
  auVar132._8_4_ = auVar23._8_4_ * fVar153;
  auVar132._12_4_ = auVar23._12_4_ * fVar152;
  auVar132._16_4_ = auVar23._16_4_ * fVar153;
  auVar132._20_4_ = auVar23._20_4_ * fVar152;
  auVar132._24_4_ = auVar23._24_4_ * fVar153;
  auVar132._28_4_ = fVar152;
  auVar20 = vfmadd231ps_fma(auVar126,auVar233,auVar133);
  auVar9 = vfmadd231ps_fma(auVar168,auVar233,auVar221);
  auVar10 = vfmadd231ps_fma(auVar132,auVar233,auVar210);
  auVar121 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar230,auVar125);
  auVar154 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar230,auVar147);
  local_2e0._8_4_ = 0x7fffffff;
  local_2e0._0_8_ = 0x7fffffff7fffffff;
  local_2e0._12_4_ = 0x7fffffff;
  local_2e0._16_4_ = 0x7fffffff;
  local_2e0._20_4_ = 0x7fffffff;
  local_2e0._24_4_ = 0x7fffffff;
  local_2e0._28_4_ = 0x7fffffff;
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar164._16_4_ = 0x219392ef;
  auVar164._20_4_ = 0x219392ef;
  auVar164._24_4_ = 0x219392ef;
  auVar164._28_4_ = 0x219392ef;
  auVar125 = vandps_avx(ZEXT1632(auVar8),local_2e0);
  auVar125 = vcmpps_avx(auVar125,auVar164,1);
  auVar133 = vblendvps_avx(ZEXT1632(auVar8),auVar164,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar21),local_2e0);
  auVar125 = vcmpps_avx(auVar125,auVar164,1);
  auVar132 = vblendvps_avx(ZEXT1632(auVar21),auVar164,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar7),local_2e0);
  auVar125 = vcmpps_avx(auVar125,auVar164,1);
  auVar125 = vblendvps_avx(ZEXT1632(auVar7),auVar164,auVar125);
  auVar25 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar230,auVar203);
  auVar147 = vrcpps_avx(auVar133);
  auVar197._8_4_ = 0x3f800000;
  auVar197._0_8_ = &DAT_3f8000003f800000;
  auVar197._12_4_ = 0x3f800000;
  auVar197._16_4_ = 0x3f800000;
  auVar197._20_4_ = 0x3f800000;
  auVar197._24_4_ = 0x3f800000;
  auVar197._28_4_ = 0x3f800000;
  auVar20 = vfnmadd213ps_fma(auVar133,auVar147,auVar197);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar147,auVar147);
  auVar133 = vrcpps_avx(auVar132);
  auVar21 = vfnmadd213ps_fma(auVar132,auVar133,auVar197);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar133,auVar133);
  auVar133 = vrcpps_avx(auVar125);
  auVar7 = vfnmadd213ps_fma(auVar125,auVar133,auVar197);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar133,auVar133);
  fVar153 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar187._4_4_ = fVar153;
  auVar187._0_4_ = fVar153;
  auVar187._8_4_ = fVar153;
  auVar187._12_4_ = fVar153;
  auVar187._16_4_ = fVar153;
  auVar187._20_4_ = fVar153;
  auVar187._24_4_ = fVar153;
  auVar187._28_4_ = fVar153;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 7 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0xb + 6));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar125);
  auVar132 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 9 + 6));
  auVar8 = vfmadd213ps_fma(auVar133,auVar187,auVar125);
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0xd + 6));
  auVar125 = vcvtdq2ps_avx(auVar132);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar125);
  auVar9 = vfmadd213ps_fma(auVar133,auVar187,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0x12 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  uVar113 = (ulong)(uint)((int)(uVar111 * 5) << 2);
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 2 + uVar113 + 6));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar125);
  auVar132 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar113 + 6));
  auVar10 = vfmadd213ps_fma(auVar133,auVar187,auVar125);
  auVar125 = vcvtdq2ps_avx(auVar132);
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0x18 + 6));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar125);
  auVar11 = vfmadd213ps_fma(auVar133,auVar187,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0x1d + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 + (ulong)(byte)PVar14 * 0x20 + 6))
  ;
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar125);
  auVar12 = vfmadd213ps_fma(auVar133,auVar187,auVar125);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + ((ulong)(byte)PVar14 * 0x20 - uVar111) + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar133 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar111 * 0x23 + 6));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar133 = vsubps_avx(auVar133,auVar125);
  auVar13 = vfmadd213ps_fma(auVar133,auVar187,auVar125);
  auVar125 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar121));
  auVar147._4_4_ = auVar20._4_4_ * auVar125._4_4_;
  auVar147._0_4_ = auVar20._0_4_ * auVar125._0_4_;
  auVar147._8_4_ = auVar20._8_4_ * auVar125._8_4_;
  auVar147._12_4_ = auVar20._12_4_ * auVar125._12_4_;
  auVar147._16_4_ = auVar125._16_4_ * 0.0;
  auVar147._20_4_ = auVar125._20_4_ * 0.0;
  auVar147._24_4_ = auVar125._24_4_ * 0.0;
  auVar147._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar121));
  auVar221._4_4_ = auVar20._4_4_ * auVar125._4_4_;
  auVar221._0_4_ = auVar20._0_4_ * auVar125._0_4_;
  auVar221._8_4_ = auVar20._8_4_ * auVar125._8_4_;
  auVar221._12_4_ = auVar20._12_4_ * auVar125._12_4_;
  auVar221._16_4_ = auVar125._16_4_ * 0.0;
  auVar221._20_4_ = auVar125._20_4_ * 0.0;
  auVar221._24_4_ = auVar125._24_4_ * 0.0;
  auVar221._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar154));
  auVar22._4_4_ = auVar21._4_4_ * auVar125._4_4_;
  auVar22._0_4_ = auVar21._0_4_ * auVar125._0_4_;
  auVar22._8_4_ = auVar21._8_4_ * auVar125._8_4_;
  auVar22._12_4_ = auVar21._12_4_ * auVar125._12_4_;
  auVar22._16_4_ = auVar125._16_4_ * 0.0;
  auVar22._20_4_ = auVar125._20_4_ * 0.0;
  auVar22._24_4_ = auVar125._24_4_ * 0.0;
  auVar22._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar154));
  auVar203._4_4_ = auVar21._4_4_ * auVar125._4_4_;
  auVar203._0_4_ = auVar21._0_4_ * auVar125._0_4_;
  auVar203._8_4_ = auVar21._8_4_ * auVar125._8_4_;
  auVar203._12_4_ = auVar21._12_4_ * auVar125._12_4_;
  auVar203._16_4_ = auVar125._16_4_ * 0.0;
  auVar203._20_4_ = auVar125._20_4_ * 0.0;
  auVar203._24_4_ = auVar125._24_4_ * 0.0;
  auVar203._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar25));
  auVar210._4_4_ = auVar7._4_4_ * auVar125._4_4_;
  auVar210._0_4_ = auVar7._0_4_ * auVar125._0_4_;
  auVar210._8_4_ = auVar7._8_4_ * auVar125._8_4_;
  auVar210._12_4_ = auVar7._12_4_ * auVar125._12_4_;
  auVar210._16_4_ = auVar125._16_4_ * 0.0;
  auVar210._20_4_ = auVar125._20_4_ * 0.0;
  auVar210._24_4_ = auVar125._24_4_ * 0.0;
  auVar210._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar25));
  auVar23._4_4_ = auVar7._4_4_ * auVar125._4_4_;
  auVar23._0_4_ = auVar7._0_4_ * auVar125._0_4_;
  auVar23._8_4_ = auVar7._8_4_ * auVar125._8_4_;
  auVar23._12_4_ = auVar7._12_4_ * auVar125._12_4_;
  auVar23._16_4_ = auVar125._16_4_ * 0.0;
  auVar23._20_4_ = auVar125._20_4_ * 0.0;
  auVar23._24_4_ = auVar125._24_4_ * 0.0;
  auVar23._28_4_ = auVar125._28_4_;
  auVar125 = vpminsd_avx2(auVar147,auVar221);
  auVar133 = vpminsd_avx2(auVar22,auVar203);
  auVar125 = vmaxps_avx(auVar125,auVar133);
  auVar133 = vpminsd_avx2(auVar210,auVar23);
  uVar119 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar200._4_4_ = uVar119;
  auVar200._0_4_ = uVar119;
  auVar200._8_4_ = uVar119;
  auVar200._12_4_ = uVar119;
  auVar200._16_4_ = uVar119;
  auVar200._20_4_ = uVar119;
  auVar200._24_4_ = uVar119;
  auVar200._28_4_ = uVar119;
  auVar133 = vmaxps_avx(auVar133,auVar200);
  auVar125 = vmaxps_avx(auVar125,auVar133);
  local_80._4_4_ = auVar125._4_4_ * 0.99999964;
  local_80._0_4_ = auVar125._0_4_ * 0.99999964;
  local_80._8_4_ = auVar125._8_4_ * 0.99999964;
  local_80._12_4_ = auVar125._12_4_ * 0.99999964;
  local_80._16_4_ = auVar125._16_4_ * 0.99999964;
  local_80._20_4_ = auVar125._20_4_ * 0.99999964;
  local_80._24_4_ = auVar125._24_4_ * 0.99999964;
  local_80._28_4_ = auVar125._28_4_;
  auVar125 = vpmaxsd_avx2(auVar147,auVar221);
  auVar133 = vpmaxsd_avx2(auVar22,auVar203);
  auVar125 = vminps_avx(auVar125,auVar133);
  auVar133 = vpmaxsd_avx2(auVar210,auVar23);
  uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar142._4_4_ = uVar119;
  auVar142._0_4_ = uVar119;
  auVar142._8_4_ = uVar119;
  auVar142._12_4_ = uVar119;
  auVar142._16_4_ = uVar119;
  auVar142._20_4_ = uVar119;
  auVar142._24_4_ = uVar119;
  auVar142._28_4_ = uVar119;
  auVar133 = vminps_avx(auVar133,auVar142);
  auVar125 = vminps_avx(auVar125,auVar133);
  auVar133._4_4_ = auVar125._4_4_ * 1.0000004;
  auVar133._0_4_ = auVar125._0_4_ * 1.0000004;
  auVar133._8_4_ = auVar125._8_4_ * 1.0000004;
  auVar133._12_4_ = auVar125._12_4_ * 1.0000004;
  auVar133._16_4_ = auVar125._16_4_ * 1.0000004;
  auVar133._20_4_ = auVar125._20_4_ * 1.0000004;
  auVar133._24_4_ = auVar125._24_4_ * 1.0000004;
  auVar133._28_4_ = auVar125._28_4_;
  auVar149._1_3_ = 0;
  auVar149[0] = PVar14;
  auVar149[4] = PVar14;
  auVar149._5_3_ = 0;
  auVar149[8] = PVar14;
  auVar149._9_3_ = 0;
  auVar149[0xc] = PVar14;
  auVar149._13_3_ = 0;
  auVar149[0x10] = PVar14;
  auVar149._17_3_ = 0;
  auVar149[0x14] = PVar14;
  auVar149._21_3_ = 0;
  auVar149[0x18] = PVar14;
  auVar149._25_3_ = 0;
  auVar149[0x1c] = PVar14;
  auVar149._29_3_ = 0;
  auVar125 = vcmpps_avx(local_80,auVar133,2);
  auVar133 = vpcmpgtd_avx2(auVar149,_DAT_0205a920);
  auVar125 = vandps_avx(auVar125,auVar133);
  uVar109 = vmovmskps_avx(auVar125);
  local_96d = uVar109 != 0;
  if (local_96d) {
    uVar109 = uVar109 & 0xff;
    local_5e0 = mm_lookupmask_ps._16_8_;
    uStack_5d8 = mm_lookupmask_ps._24_8_;
    uStack_5d0 = mm_lookupmask_ps._16_8_;
    uStack_5c8 = mm_lookupmask_ps._24_8_;
    local_5f0 = pre->ray_space + k;
    iVar110 = 1 << ((uint)k & 0x1f);
    auVar125._4_4_ = iVar110;
    auVar125._0_4_ = iVar110;
    auVar125._8_4_ = iVar110;
    auVar125._12_4_ = iVar110;
    auVar125._16_4_ = iVar110;
    auVar125._20_4_ = iVar110;
    auVar125._24_4_ = iVar110;
    auVar125._28_4_ = iVar110;
    auVar133 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar125 = vpand_avx2(auVar125,auVar133);
    local_300 = vpcmpeqd_avx2(auVar125,auVar133);
    local_470 = 0x7fffffff;
    uStack_46c = 0x7fffffff;
    uStack_468 = 0x7fffffff;
    uStack_464 = 0x7fffffff;
    local_5e8 = prim;
    do {
      auVar125 = local_560;
      lVar24 = 0;
      for (uVar111 = (ulong)uVar109; (uVar111 & 1) == 0; uVar111 = uVar111 >> 1 | 0x8000000000000000
          ) {
        lVar24 = lVar24 + 1;
      }
      uVar15 = *(uint *)(local_5e8 + 2);
      local_760._4_4_ = *(undefined4 *)(local_5e8 + lVar24 * 4 + 6);
      pGVar16 = (context->scene->geometries).items[uVar15].ptr;
      local_580._0_8_ = CONCAT44(0,local_760._4_4_);
      uVar111 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                                CONCAT44(0,local_760._4_4_) *
                                pGVar16[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar153 = (pGVar16->time_range).lower;
      fVar153 = pGVar16->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar153) /
                ((pGVar16->time_range).upper - fVar153));
      auVar20 = vroundss_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),9);
      auVar20 = vminss_avx(auVar20,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
      auVar20 = vmaxss_avx(ZEXT816(0) << 0x20,auVar20);
      fVar153 = fVar153 - auVar20._0_4_;
      _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar114 = (long)(int)auVar20._0_4_ * 0x38;
      lVar24 = *(long *)(_Var17 + 0x10 + lVar114);
      lVar116 = *(long *)(_Var17 + 0x38 + lVar114);
      lVar18 = *(long *)(_Var17 + 0x48 + lVar114);
      pfVar1 = (float *)(lVar116 + uVar111 * lVar18);
      auVar181._0_4_ = fVar153 * *pfVar1;
      auVar181._4_4_ = fVar153 * pfVar1[1];
      auVar181._8_4_ = fVar153 * pfVar1[2];
      auVar181._12_4_ = fVar153 * pfVar1[3];
      pfVar1 = (float *)(lVar116 + (uVar111 + 1) * lVar18);
      auVar211._0_4_ = fVar153 * *pfVar1;
      auVar211._4_4_ = fVar153 * pfVar1[1];
      auVar211._8_4_ = fVar153 * pfVar1[2];
      auVar211._12_4_ = fVar153 * pfVar1[3];
      pfVar1 = (float *)(lVar116 + (uVar111 + 2) * lVar18);
      auVar155._0_4_ = fVar153 * *pfVar1;
      auVar155._4_4_ = fVar153 * pfVar1[1];
      auVar155._8_4_ = fVar153 * pfVar1[2];
      auVar155._12_4_ = fVar153 * pfVar1[3];
      pfVar1 = (float *)(lVar116 + lVar18 * (uVar111 + 3));
      auVar172._0_4_ = fVar153 * *pfVar1;
      auVar172._4_4_ = fVar153 * pfVar1[1];
      auVar172._8_4_ = fVar153 * pfVar1[2];
      auVar172._12_4_ = fVar153 * pfVar1[3];
      lVar116 = *(long *)(_Var17 + lVar114);
      fVar153 = 1.0 - fVar153;
      auVar122._4_4_ = fVar153;
      auVar122._0_4_ = fVar153;
      auVar122._8_4_ = fVar153;
      auVar122._12_4_ = fVar153;
      auVar10 = vfmadd231ps_fma(auVar181,auVar122,*(undefined1 (*) [16])(lVar116 + lVar24 * uVar111)
                               );
      local_600 = vfmadd231ps_fma(auVar211,auVar122,
                                  *(undefined1 (*) [16])(lVar116 + lVar24 * (uVar111 + 1)));
      local_610 = vfmadd231ps_fma(auVar155,auVar122,
                                  *(undefined1 (*) [16])(lVar116 + lVar24 * (uVar111 + 2)));
      local_620 = vfmadd231ps_fma(auVar172,auVar122,
                                  *(undefined1 (*) [16])(lVar116 + lVar24 * (uVar111 + 3)));
      iVar110 = (int)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar24 = (long)iVar110 * 0x44;
      auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar8 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar21 = vsubps_avx(auVar10,auVar8);
      uVar119 = auVar21._0_4_;
      auVar156._4_4_ = uVar119;
      auVar156._0_4_ = uVar119;
      auVar156._8_4_ = uVar119;
      auVar156._12_4_ = uVar119;
      auVar20 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      aVar5 = (local_5f0->vx).field_0;
      aVar6 = (local_5f0->vy).field_0;
      fVar153 = (local_5f0->vz).field_0.m128[0];
      fVar152 = (local_5f0->vz).field_0.m128[1];
      fVar135 = (local_5f0->vz).field_0.m128[2];
      fVar136 = (local_5f0->vz).field_0.m128[3];
      auVar205._0_4_ = fVar153 * auVar21._0_4_;
      auVar205._4_4_ = fVar152 * auVar21._4_4_;
      auVar205._8_4_ = fVar135 * auVar21._8_4_;
      auVar205._12_4_ = fVar136 * auVar21._12_4_;
      auVar20 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar6,auVar20);
      auVar11 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar5,auVar156);
      auVar20 = vblendps_avx(auVar11,auVar10,8);
      auVar7 = vsubps_avx(local_600,auVar8);
      uVar119 = auVar7._0_4_;
      auVar173._4_4_ = uVar119;
      auVar173._0_4_ = uVar119;
      auVar173._8_4_ = uVar119;
      auVar173._12_4_ = uVar119;
      auVar21 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar206._0_4_ = fVar153 * auVar7._0_4_;
      auVar206._4_4_ = fVar152 * auVar7._4_4_;
      auVar206._8_4_ = fVar135 * auVar7._8_4_;
      auVar206._12_4_ = fVar136 * auVar7._12_4_;
      auVar21 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar6,auVar21);
      auVar12 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar5,auVar173);
      auVar21 = vblendps_avx(auVar12,local_600,8);
      auVar9 = vsubps_avx(local_610,auVar8);
      uVar119 = auVar9._0_4_;
      auVar195._4_4_ = uVar119;
      auVar195._0_4_ = uVar119;
      auVar195._8_4_ = uVar119;
      auVar195._12_4_ = uVar119;
      auVar7 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar215._0_4_ = fVar153 * auVar9._0_4_;
      auVar215._4_4_ = fVar152 * auVar9._4_4_;
      auVar215._8_4_ = fVar135 * auVar9._8_4_;
      auVar215._12_4_ = fVar136 * auVar9._12_4_;
      auVar7 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar6,auVar7);
      auVar13 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar5,auVar195);
      auVar7 = vblendps_avx(auVar13,local_610,8);
      auVar9 = vsubps_avx(local_620,auVar8);
      uVar119 = auVar9._0_4_;
      auVar196._4_4_ = uVar119;
      auVar196._0_4_ = uVar119;
      auVar196._8_4_ = uVar119;
      auVar196._12_4_ = uVar119;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar220._0_4_ = fVar153 * auVar9._0_4_;
      auVar220._4_4_ = fVar152 * auVar9._4_4_;
      auVar220._8_4_ = fVar135 * auVar9._8_4_;
      auVar220._12_4_ = fVar136 * auVar9._12_4_;
      auVar8 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar6,auVar8);
      auVar121 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar5,auVar196);
      auVar8 = vblendps_avx(auVar121,local_620,8);
      auVar25._4_4_ = uStack_46c;
      auVar25._0_4_ = local_470;
      auVar25._8_4_ = uStack_468;
      auVar25._12_4_ = uStack_464;
      auVar20 = vandps_avx(auVar20,auVar25);
      auVar21 = vandps_avx(auVar21,auVar25);
      auVar9 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vandps_avx(auVar7,auVar25);
      auVar21 = vandps_avx(auVar8,auVar25);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar9,auVar20);
      auVar21 = vmovshdup_avx(auVar20);
      auVar21 = vmaxss_avx(auVar21,auVar20);
      auVar20 = vshufpd_avx(auVar20,auVar20,1);
      auVar20 = vmaxss_avx(auVar20,auVar21);
      auVar21 = vmovshdup_avx(auVar11);
      uVar120 = auVar21._0_8_;
      local_4a0._8_8_ = uVar120;
      local_4a0._0_8_ = uVar120;
      local_4a0._16_8_ = uVar120;
      local_4a0._24_8_ = uVar120;
      auVar21 = vmovshdup_avx(auVar12);
      uVar120 = auVar21._0_8_;
      local_6a0._8_8_ = uVar120;
      local_6a0._0_8_ = uVar120;
      local_6a0._16_8_ = uVar120;
      local_6a0._24_8_ = uVar120;
      auVar133 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      uVar214 = auVar13._0_4_;
      auVar163._4_4_ = uVar214;
      auVar163._0_4_ = uVar214;
      auVar163._8_4_ = uVar214;
      auVar163._12_4_ = uVar214;
      auVar163._16_4_ = uVar214;
      auVar163._20_4_ = uVar214;
      auVar163._24_4_ = uVar214;
      auVar163._28_4_ = uVar214;
      auVar21 = vmovshdup_avx(auVar13);
      uVar120 = auVar21._0_8_;
      auVar201._8_8_ = uVar120;
      auVar201._0_8_ = uVar120;
      auVar201._16_8_ = uVar120;
      auVar201._24_8_ = uVar120;
      fVar223 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar24 + 0xd8c);
      fVar88 = *(float *)(catmullrom_basis0 + lVar24 + 0xd90);
      fVar89 = *(float *)(catmullrom_basis0 + lVar24 + 0xd94);
      fVar90 = *(float *)(catmullrom_basis0 + lVar24 + 0xd98);
      fVar91 = *(float *)(catmullrom_basis0 + lVar24 + 0xd9c);
      fVar92 = *(float *)(catmullrom_basis0 + lVar24 + 0xda0);
      fVar93 = *(float *)(catmullrom_basis0 + lVar24 + 0xda4);
      auVar107 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar24 + 0xd8c);
      auVar21 = vmovshdup_avx(auVar121);
      fVar218 = auVar121._0_4_;
      auVar141._0_4_ = fVar218 * fVar223;
      auVar141._4_4_ = fVar218 * fVar88;
      auVar141._8_4_ = fVar218 * fVar89;
      auVar141._12_4_ = fVar218 * fVar90;
      auVar141._16_4_ = fVar218 * fVar91;
      auVar141._20_4_ = fVar218 * fVar92;
      auVar141._24_4_ = fVar218 * fVar93;
      auVar141._28_4_ = 0;
      auVar7 = vfmadd231ps_fma(auVar141,auVar133,auVar163);
      fVar229 = auVar21._0_4_;
      auVar186._0_4_ = fVar229 * fVar223;
      fVar231 = auVar21._4_4_;
      auVar186._4_4_ = fVar231 * fVar88;
      auVar186._8_4_ = fVar229 * fVar89;
      auVar186._12_4_ = fVar231 * fVar90;
      auVar186._16_4_ = fVar229 * fVar91;
      auVar186._20_4_ = fVar231 * fVar92;
      auVar186._24_4_ = fVar229 * fVar93;
      auVar186._28_4_ = 0;
      auVar21 = vfmadd231ps_fma(auVar186,auVar133,auVar201);
      auVar132 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      uVar119 = auVar12._0_4_;
      auVar175._4_4_ = uVar119;
      auVar175._0_4_ = uVar119;
      auVar175._8_4_ = uVar119;
      auVar175._12_4_ = uVar119;
      auVar175._16_4_ = uVar119;
      auVar175._20_4_ = uVar119;
      auVar175._24_4_ = uVar119;
      auVar175._28_4_ = uVar119;
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar132,auVar175);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar132,local_6a0);
      auVar147 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      uVar119 = auVar11._0_4_;
      auVar189._4_4_ = uVar119;
      auVar189._0_4_ = uVar119;
      auVar189._8_4_ = uVar119;
      auVar189._12_4_ = uVar119;
      auVar189._16_4_ = uVar119;
      auVar189._20_4_ = uVar119;
      auVar189._24_4_ = uVar119;
      auVar189._28_4_ = uVar119;
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar147,auVar189);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar147,local_4a0);
      auVar221 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      fVar94 = *(float *)(catmullrom_basis1 + lVar24 + 0xd8c);
      fVar95 = *(float *)(catmullrom_basis1 + lVar24 + 0xd90);
      fVar96 = *(float *)(catmullrom_basis1 + lVar24 + 0xd94);
      fVar97 = *(float *)(catmullrom_basis1 + lVar24 + 0xd98);
      fVar98 = *(float *)(catmullrom_basis1 + lVar24 + 0xd9c);
      fVar99 = *(float *)(catmullrom_basis1 + lVar24 + 0xda0);
      fVar100 = *(float *)(catmullrom_basis1 + lVar24 + 0xda4);
      auVar26._4_4_ = fVar218 * fVar95;
      auVar26._0_4_ = fVar218 * fVar94;
      auVar26._8_4_ = fVar218 * fVar96;
      auVar26._12_4_ = fVar218 * fVar97;
      auVar26._16_4_ = fVar218 * fVar98;
      auVar26._20_4_ = fVar218 * fVar99;
      auVar26._24_4_ = fVar218 * fVar100;
      auVar26._28_4_ = fVar218;
      auVar8 = vfmadd231ps_fma(auVar26,auVar221,auVar163);
      auVar27._4_4_ = fVar231 * fVar95;
      auVar27._0_4_ = fVar229 * fVar94;
      auVar27._8_4_ = fVar229 * fVar96;
      auVar27._12_4_ = fVar231 * fVar97;
      auVar27._16_4_ = fVar229 * fVar98;
      auVar27._20_4_ = fVar231 * fVar99;
      auVar27._24_4_ = fVar229 * fVar100;
      auVar27._28_4_ = uVar214;
      auVar9 = vfmadd231ps_fma(auVar27,auVar221,auVar201);
      auVar22 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,auVar175);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar22,local_6a0);
      auVar203 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar203,auVar189);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar203,local_4a0);
      auVar126 = ZEXT1632(auVar8);
      auVar142 = ZEXT1632(auVar7);
      auVar23 = vsubps_avx(auVar126,auVar142);
      auVar164 = ZEXT1632(auVar9);
      auVar187 = ZEXT1632(auVar21);
      auVar168 = vsubps_avx(auVar164,auVar187);
      auVar127._0_4_ = auVar23._0_4_ * auVar21._0_4_;
      auVar127._4_4_ = auVar23._4_4_ * auVar21._4_4_;
      auVar127._8_4_ = auVar23._8_4_ * auVar21._8_4_;
      auVar127._12_4_ = auVar23._12_4_ * auVar21._12_4_;
      auVar127._16_4_ = auVar23._16_4_ * 0.0;
      auVar127._20_4_ = auVar23._20_4_ * 0.0;
      auVar127._24_4_ = auVar23._24_4_ * 0.0;
      auVar127._28_4_ = 0;
      fVar153 = auVar168._0_4_;
      auVar143._0_4_ = auVar7._0_4_ * fVar153;
      fVar135 = auVar168._4_4_;
      auVar143._4_4_ = auVar7._4_4_ * fVar135;
      fVar137 = auVar168._8_4_;
      auVar143._8_4_ = auVar7._8_4_ * fVar137;
      fVar138 = auVar168._12_4_;
      auVar143._12_4_ = auVar7._12_4_ * fVar138;
      fVar139 = auVar168._16_4_;
      auVar143._16_4_ = fVar139 * 0.0;
      fVar140 = auVar168._20_4_;
      auVar143._20_4_ = fVar140 * 0.0;
      fVar219 = auVar168._24_4_;
      auVar143._24_4_ = fVar219 * 0.0;
      auVar143._28_4_ = 0;
      auVar149 = vsubps_avx(auVar127,auVar143);
      auVar21 = vpermilps_avx(auVar10,0xff);
      uVar120 = auVar21._0_8_;
      local_a0._8_8_ = uVar120;
      local_a0._0_8_ = uVar120;
      local_a0._16_8_ = uVar120;
      local_a0._24_8_ = uVar120;
      auVar7 = vpermilps_avx(local_600,0xff);
      uVar120 = auVar7._0_8_;
      local_c0._8_8_ = uVar120;
      local_c0._0_8_ = uVar120;
      local_c0._16_8_ = uVar120;
      local_c0._24_8_ = uVar120;
      auVar7 = vpermilps_avx(local_610,0xff);
      uVar120 = auVar7._0_8_;
      local_e0._8_8_ = uVar120;
      local_e0._0_8_ = uVar120;
      local_e0._16_8_ = uVar120;
      local_e0._24_8_ = uVar120;
      auVar7 = vpermilps_avx(local_620,0xff);
      local_100 = auVar7._0_8_;
      fVar152 = auVar7._0_4_;
      fVar136 = auVar7._4_4_;
      auVar28._4_4_ = fVar88 * fVar136;
      auVar28._0_4_ = fVar223 * fVar152;
      auVar28._8_4_ = fVar89 * fVar152;
      auVar28._12_4_ = fVar90 * fVar136;
      auVar28._16_4_ = fVar91 * fVar152;
      auVar28._20_4_ = fVar92 * fVar136;
      auVar28._24_4_ = fVar93 * fVar152;
      auVar28._28_4_ = *(undefined4 *)(catmullrom_basis0 + lVar24 + 0xda8);
      auVar7 = vfmadd231ps_fma(auVar28,local_e0,auVar133);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar132,local_c0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar147,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar29._4_4_ = fVar136 * fVar95;
      auVar29._0_4_ = fVar152 * fVar94;
      auVar29._8_4_ = fVar152 * fVar96;
      auVar29._12_4_ = fVar136 * fVar97;
      auVar29._16_4_ = fVar152 * fVar98;
      auVar29._20_4_ = fVar136 * fVar99;
      auVar29._24_4_ = fVar152 * fVar100;
      auVar29._28_4_ = auVar147._28_4_;
      auVar8 = vfmadd231ps_fma(auVar29,auVar221,local_e0);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar22,local_c0);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar203,local_a0);
      auVar30._4_4_ = fVar135 * fVar135;
      auVar30._0_4_ = fVar153 * fVar153;
      auVar30._8_4_ = fVar137 * fVar137;
      auVar30._12_4_ = fVar138 * fVar138;
      auVar30._16_4_ = fVar139 * fVar139;
      auVar30._20_4_ = fVar140 * fVar140;
      auVar30._24_4_ = fVar219 * fVar219;
      auVar30._28_4_ = auVar21._4_4_;
      auVar21 = vfmadd231ps_fma(auVar30,auVar23,auVar23);
      auVar210 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
      auVar31._4_4_ = auVar210._4_4_ * auVar210._4_4_ * auVar21._4_4_;
      auVar31._0_4_ = auVar210._0_4_ * auVar210._0_4_ * auVar21._0_4_;
      auVar31._8_4_ = auVar210._8_4_ * auVar210._8_4_ * auVar21._8_4_;
      auVar31._12_4_ = auVar210._12_4_ * auVar210._12_4_ * auVar21._12_4_;
      auVar31._16_4_ = auVar210._16_4_ * auVar210._16_4_ * 0.0;
      auVar31._20_4_ = auVar210._20_4_ * auVar210._20_4_ * 0.0;
      auVar31._24_4_ = auVar210._24_4_ * auVar210._24_4_ * 0.0;
      auVar31._28_4_ = auVar210._28_4_;
      auVar32._4_4_ = auVar149._4_4_ * auVar149._4_4_;
      auVar32._0_4_ = auVar149._0_4_ * auVar149._0_4_;
      auVar32._8_4_ = auVar149._8_4_ * auVar149._8_4_;
      auVar32._12_4_ = auVar149._12_4_ * auVar149._12_4_;
      auVar32._16_4_ = auVar149._16_4_ * auVar149._16_4_;
      auVar32._20_4_ = auVar149._20_4_ * auVar149._20_4_;
      auVar32._24_4_ = auVar149._24_4_ * auVar149._24_4_;
      auVar32._28_4_ = auVar149._28_4_;
      auVar210 = vcmpps_avx(auVar32,auVar31,2);
      auVar171 = ZEXT3264(auVar210);
      fVar153 = auVar20._0_4_ * 4.7683716e-07;
      auVar128._0_4_ = (float)iVar110;
      local_560._4_12_ = auVar121._4_12_;
      local_560._0_4_ = auVar128._0_4_;
      local_560._16_16_ = auVar125._16_16_;
      auVar128._4_4_ = auVar128._0_4_;
      auVar128._8_4_ = auVar128._0_4_;
      auVar128._12_4_ = auVar128._0_4_;
      auVar128._16_4_ = auVar128._0_4_;
      auVar128._20_4_ = auVar128._0_4_;
      auVar128._24_4_ = auVar128._0_4_;
      auVar128._28_4_ = auVar128._0_4_;
      auVar125 = vcmpps_avx(_DAT_02020f40,auVar128,1);
      auVar20 = vpermilps_avx(auVar11,0xaa);
      uVar120 = auVar20._0_8_;
      local_5c0._8_8_ = uVar120;
      local_5c0._0_8_ = uVar120;
      local_5c0._16_8_ = uVar120;
      local_5c0._24_8_ = uVar120;
      auVar20 = vpermilps_avx(auVar12,0xaa);
      uVar120 = auVar20._0_8_;
      auVar176._8_8_ = uVar120;
      auVar176._0_8_ = uVar120;
      auVar176._16_8_ = uVar120;
      auVar176._24_8_ = uVar120;
      auVar179 = ZEXT3264(auVar176);
      auVar20 = vpermilps_avx(auVar13,0xaa);
      uVar120 = auVar20._0_8_;
      local_520._8_8_ = uVar120;
      local_520._0_8_ = uVar120;
      local_520._16_8_ = uVar120;
      local_520._24_8_ = uVar120;
      auVar20 = vshufps_avx(auVar121,auVar121,0xaa);
      uVar120 = auVar20._0_8_;
      auVar149 = auVar125 & auVar210;
      uVar112 = *(uint *)(ray + k * 4 + 0x60);
      local_720._0_16_ = ZEXT416(uVar112);
      local_7d0 = auVar10._0_8_;
      uStack_7c8 = auVar10._8_8_;
      uVar224 = uVar120;
      uVar225 = uVar120;
      uVar226 = uVar120;
      if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar149 >> 0x7f,0) == '\0') &&
            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar149 >> 0xbf,0) == '\0') &&
          (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar149[0x1f]) {
        bVar117 = false;
        auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,CONCAT416(fVar218,
                                                  CONCAT412(fVar218,CONCAT48(fVar218,CONCAT44(
                                                  fVar218,fVar218))))))));
      }
      else {
        auVar210 = vandps_avx(auVar210,auVar125);
        fVar219 = auVar20._0_4_;
        fVar223 = auVar20._4_4_;
        auVar33._4_4_ = fVar223 * fVar95;
        auVar33._0_4_ = fVar219 * fVar94;
        auVar33._8_4_ = fVar219 * fVar96;
        auVar33._12_4_ = fVar223 * fVar97;
        auVar33._16_4_ = fVar219 * fVar98;
        auVar33._20_4_ = fVar223 * fVar99;
        auVar33._24_4_ = fVar219 * fVar100;
        auVar33._28_4_ = auVar210._28_4_;
        auVar20 = vfmadd213ps_fma(auVar221,local_520,auVar33);
        auVar20 = vfmadd213ps_fma(auVar22,auVar176,ZEXT1632(auVar20));
        auVar20 = vfmadd213ps_fma(auVar203,local_5c0,ZEXT1632(auVar20));
        local_4c0 = ZEXT1632(auVar20);
        local_700._0_4_ = auVar107._0_4_;
        local_700._4_4_ = auVar107._4_4_;
        fStack_6f8 = auVar107._8_4_;
        fStack_6f4 = auVar107._12_4_;
        auStack_6f0._0_4_ = auVar107._16_4_;
        auStack_6f0._4_4_ = auVar107._20_4_;
        fStack_6e8 = auVar107._24_4_;
        auVar34._4_4_ = fVar223 * (float)local_700._4_4_;
        auVar34._0_4_ = fVar219 * (float)local_700._0_4_;
        auVar34._8_4_ = fVar219 * fStack_6f8;
        auVar34._12_4_ = fVar223 * fStack_6f4;
        auVar34._16_4_ = fVar219 * (float)auStack_6f0._0_4_;
        auVar34._20_4_ = fVar223 * (float)auStack_6f0._4_4_;
        auVar34._24_4_ = fVar219 * fStack_6e8;
        auVar34._28_4_ = auVar210._28_4_;
        auVar20 = vfmadd213ps_fma(auVar133,local_520,auVar34);
        auVar20 = vfmadd213ps_fma(auVar132,auVar176,ZEXT1632(auVar20));
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar133 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar132 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        fVar152 = *(float *)(catmullrom_basis0 + lVar24 + 0x1f9c);
        fVar135 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa0);
        fVar136 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa4);
        fVar137 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa8);
        fVar138 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fac);
        fVar139 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fb0);
        fVar140 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fb4);
        auVar35._4_4_ = fVar218 * fVar135;
        auVar35._0_4_ = fVar218 * fVar152;
        auVar35._8_4_ = fVar218 * fVar136;
        auVar35._12_4_ = fVar218 * fVar137;
        auVar35._16_4_ = fVar218 * fVar138;
        auVar35._20_4_ = fVar218 * fVar139;
        auVar35._24_4_ = fVar218 * fVar140;
        auVar35._28_4_ = auVar23._28_4_;
        auVar202._0_4_ = fVar229 * fVar152;
        auVar202._4_4_ = fVar231 * fVar135;
        auVar202._8_4_ = fVar229 * fVar136;
        auVar202._12_4_ = fVar231 * fVar137;
        auVar202._16_4_ = fVar229 * fVar138;
        auVar202._20_4_ = fVar231 * fVar139;
        auVar202._24_4_ = fVar229 * fVar140;
        auVar202._28_4_ = 0;
        auVar212._0_4_ = fVar152 * fVar219;
        auVar212._4_4_ = fVar135 * fVar223;
        auVar212._8_4_ = fVar136 * fVar219;
        auVar212._12_4_ = fVar137 * fVar223;
        auVar212._16_4_ = fVar138 * fVar219;
        auVar212._20_4_ = fVar139 * fVar223;
        auVar212._24_4_ = fVar140 * fVar219;
        auVar212._28_4_ = 0;
        auVar21 = vfmadd231ps_fma(auVar35,auVar132,auVar163);
        auVar9 = vfmadd231ps_fma(auVar202,auVar132,auVar201);
        auVar11 = vfmadd231ps_fma(auVar212,local_520,auVar132);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar133,auVar175);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar133,local_6a0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar176,auVar133);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar125,auVar189);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar125,local_4a0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_5c0,auVar125);
        fVar152 = *(float *)(catmullrom_basis1 + lVar24 + 0x1f9c);
        fVar135 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa0);
        fVar136 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa4);
        fVar137 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa8);
        fVar138 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fac);
        fVar139 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fb0);
        fVar140 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fb4);
        auVar36._4_4_ = fVar218 * fVar135;
        auVar36._0_4_ = fVar218 * fVar152;
        auVar36._8_4_ = fVar218 * fVar136;
        auVar36._12_4_ = fVar218 * fVar137;
        auVar36._16_4_ = fVar218 * fVar138;
        auVar36._20_4_ = fVar218 * fVar139;
        auVar36._24_4_ = fVar218 * fVar140;
        auVar36._28_4_ = fVar218;
        auVar37._4_4_ = fVar231 * fVar135;
        auVar37._0_4_ = fVar229 * fVar152;
        auVar37._8_4_ = fVar229 * fVar136;
        auVar37._12_4_ = fVar231 * fVar137;
        auVar37._16_4_ = fVar229 * fVar138;
        auVar37._20_4_ = fVar231 * fVar139;
        auVar37._24_4_ = fVar229 * fVar140;
        auVar37._28_4_ = fVar231;
        auVar38._4_4_ = fVar223 * fVar135;
        auVar38._0_4_ = fVar219 * fVar152;
        auVar38._8_4_ = fVar219 * fVar136;
        auVar38._12_4_ = fVar223 * fVar137;
        auVar38._16_4_ = fVar219 * fVar138;
        auVar38._20_4_ = fVar223 * fVar139;
        auVar38._24_4_ = fVar219 * fVar140;
        auVar38._28_4_ = fVar223;
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar12 = vfmadd231ps_fma(auVar36,auVar125,auVar163);
        auVar13 = vfmadd231ps_fma(auVar37,auVar125,auVar201);
        auVar121 = vfmadd231ps_fma(auVar38,auVar125,local_520);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar125,auVar175);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar125,local_6a0);
        auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar125,auVar176);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar125,auVar189);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar125,local_4a0);
        auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),local_5c0,auVar125);
        auVar125 = vandps_avx(local_2e0,ZEXT1632(auVar21));
        auVar133 = vandps_avx(ZEXT1632(auVar9),local_2e0);
        auVar133 = vmaxps_avx(auVar125,auVar133);
        auVar125 = vandps_avx(ZEXT1632(auVar11),local_2e0);
        auVar125 = vmaxps_avx(auVar133,auVar125);
        auVar144._4_4_ = fVar153;
        auVar144._0_4_ = fVar153;
        auVar144._8_4_ = fVar153;
        auVar144._12_4_ = fVar153;
        auVar144._16_4_ = fVar153;
        auVar144._20_4_ = fVar153;
        auVar144._24_4_ = fVar153;
        auVar144._28_4_ = fVar153;
        auVar125 = vcmpps_avx(auVar125,auVar144,1);
        auVar132 = vblendvps_avx(ZEXT1632(auVar21),auVar23,auVar125);
        auVar221 = vblendvps_avx(ZEXT1632(auVar9),auVar168,auVar125);
        auVar125 = vandps_avx(ZEXT1632(auVar12),local_2e0);
        auVar133 = vandps_avx(ZEXT1632(auVar13),local_2e0);
        auVar133 = vmaxps_avx(auVar125,auVar133);
        auVar125 = vandps_avx(ZEXT1632(auVar121),local_2e0);
        auVar125 = vmaxps_avx(auVar133,auVar125);
        auVar133 = vcmpps_avx(auVar125,auVar144,1);
        auVar125 = vblendvps_avx(ZEXT1632(auVar12),auVar23,auVar133);
        auVar133 = vblendvps_avx(ZEXT1632(auVar13),auVar168,auVar133);
        auVar20 = vfmadd213ps_fma(auVar147,local_5c0,ZEXT1632(auVar20));
        auVar21 = vfmadd213ps_fma(auVar132,auVar132,ZEXT832(0) << 0x20);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar221,auVar221);
        auVar147 = vrsqrtps_avx(ZEXT1632(auVar21));
        fVar152 = auVar147._0_4_;
        fVar135 = auVar147._4_4_;
        fVar136 = auVar147._8_4_;
        fVar137 = auVar147._12_4_;
        fVar138 = auVar147._16_4_;
        fVar139 = auVar147._20_4_;
        fVar140 = auVar147._24_4_;
        auVar39._4_4_ = fVar135 * fVar135 * fVar135 * auVar21._4_4_ * -0.5;
        auVar39._0_4_ = fVar152 * fVar152 * fVar152 * auVar21._0_4_ * -0.5;
        auVar39._8_4_ = fVar136 * fVar136 * fVar136 * auVar21._8_4_ * -0.5;
        auVar39._12_4_ = fVar137 * fVar137 * fVar137 * auVar21._12_4_ * -0.5;
        auVar39._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar39._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar39._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar39._28_4_ = 0;
        auVar227._8_4_ = 0x3fc00000;
        auVar227._0_8_ = 0x3fc000003fc00000;
        auVar227._12_4_ = 0x3fc00000;
        auVar227._16_4_ = 0x3fc00000;
        auVar227._20_4_ = 0x3fc00000;
        auVar227._24_4_ = 0x3fc00000;
        auVar227._28_4_ = 0x3fc00000;
        auVar21 = vfmadd231ps_fma(auVar39,auVar227,auVar147);
        fVar152 = auVar21._0_4_;
        fVar135 = auVar21._4_4_;
        auVar40._4_4_ = auVar221._4_4_ * fVar135;
        auVar40._0_4_ = auVar221._0_4_ * fVar152;
        fVar136 = auVar21._8_4_;
        auVar40._8_4_ = auVar221._8_4_ * fVar136;
        fVar137 = auVar21._12_4_;
        auVar40._12_4_ = auVar221._12_4_ * fVar137;
        auVar40._16_4_ = auVar221._16_4_ * 0.0;
        auVar40._20_4_ = auVar221._20_4_ * 0.0;
        auVar40._24_4_ = auVar221._24_4_ * 0.0;
        auVar40._28_4_ = auVar147._28_4_;
        auVar41._4_4_ = -auVar132._4_4_ * fVar135;
        auVar41._0_4_ = -auVar132._0_4_ * fVar152;
        auVar41._8_4_ = -auVar132._8_4_ * fVar136;
        auVar41._12_4_ = -auVar132._12_4_ * fVar137;
        auVar41._16_4_ = -auVar132._16_4_ * 0.0;
        auVar41._20_4_ = -auVar132._20_4_ * 0.0;
        auVar41._24_4_ = -auVar132._24_4_ * 0.0;
        auVar41._28_4_ = 0;
        auVar21 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar133,auVar133);
        auVar132 = vrsqrtps_avx(ZEXT1632(auVar21));
        auVar147 = ZEXT1632(CONCAT412(fVar137 * 0.0,
                                      CONCAT48(fVar136 * 0.0,CONCAT44(fVar135 * 0.0,fVar152 * 0.0)))
                           );
        fVar152 = auVar132._0_4_;
        fVar135 = auVar132._4_4_;
        fVar136 = auVar132._8_4_;
        fVar137 = auVar132._12_4_;
        fVar138 = auVar132._16_4_;
        fVar139 = auVar132._20_4_;
        fVar140 = auVar132._24_4_;
        auVar42._4_4_ = fVar135 * fVar135 * fVar135 * auVar21._4_4_ * -0.5;
        auVar42._0_4_ = fVar152 * fVar152 * fVar152 * auVar21._0_4_ * -0.5;
        auVar42._8_4_ = fVar136 * fVar136 * fVar136 * auVar21._8_4_ * -0.5;
        auVar42._12_4_ = fVar137 * fVar137 * fVar137 * auVar21._12_4_ * -0.5;
        auVar42._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
        auVar42._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
        auVar42._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
        auVar42._28_4_ = 0xbf000000;
        auVar21 = vfmadd231ps_fma(auVar42,auVar227,auVar132);
        fVar152 = auVar21._0_4_;
        fVar135 = auVar21._4_4_;
        auVar43._4_4_ = fVar135 * auVar133._4_4_;
        auVar43._0_4_ = fVar152 * auVar133._0_4_;
        fVar136 = auVar21._8_4_;
        auVar43._8_4_ = fVar136 * auVar133._8_4_;
        fVar137 = auVar21._12_4_;
        auVar43._12_4_ = fVar137 * auVar133._12_4_;
        auVar43._16_4_ = auVar133._16_4_ * 0.0;
        auVar43._20_4_ = auVar133._20_4_ * 0.0;
        auVar43._24_4_ = auVar133._24_4_ * 0.0;
        auVar43._28_4_ = 0;
        auVar44._4_4_ = fVar135 * -auVar125._4_4_;
        auVar44._0_4_ = fVar152 * -auVar125._0_4_;
        auVar44._8_4_ = fVar136 * -auVar125._8_4_;
        auVar44._12_4_ = fVar137 * -auVar125._12_4_;
        auVar44._16_4_ = -auVar125._16_4_ * 0.0;
        auVar44._20_4_ = -auVar125._20_4_ * 0.0;
        auVar44._24_4_ = -auVar125._24_4_ * 0.0;
        auVar44._28_4_ = 0x3fc00000;
        auVar45._28_4_ = auVar132._28_4_;
        auVar45._0_28_ =
             ZEXT1628(CONCAT412(fVar137 * 0.0,
                                CONCAT48(fVar136 * 0.0,CONCAT44(fVar135 * 0.0,fVar152 * 0.0))));
        auVar21 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar7),auVar142);
        auVar125 = ZEXT1632(auVar7);
        auVar9 = vfmadd213ps_fma(auVar41,auVar125,auVar187);
        auVar11 = vfmadd213ps_fma(auVar147,auVar125,ZEXT1632(auVar20));
        auVar154 = vfnmadd213ps_fma(auVar40,auVar125,auVar142);
        auVar12 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar8),auVar126);
        auVar25 = vfnmadd213ps_fma(auVar41,auVar125,auVar187);
        auVar125 = ZEXT1632(auVar8);
        auVar13 = vfmadd213ps_fma(auVar44,auVar125,auVar164);
        auVar216 = ZEXT1632(auVar7);
        auVar20 = vfnmadd231ps_fma(ZEXT1632(auVar20),auVar216,auVar147);
        auVar7 = vfmadd213ps_fma(auVar45,auVar125,local_4c0);
        auVar122 = vfnmadd213ps_fma(auVar43,auVar125,auVar126);
        auVar155 = vfnmadd213ps_fma(auVar44,auVar125,auVar164);
        auVar156 = vfnmadd231ps_fma(local_4c0,ZEXT1632(auVar8),auVar45);
        auVar125 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar25));
        auVar133 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar20));
        auVar165._0_4_ = auVar125._0_4_ * auVar20._0_4_;
        auVar165._4_4_ = auVar125._4_4_ * auVar20._4_4_;
        auVar165._8_4_ = auVar125._8_4_ * auVar20._8_4_;
        auVar165._12_4_ = auVar125._12_4_ * auVar20._12_4_;
        auVar165._16_4_ = auVar125._16_4_ * 0.0;
        auVar165._20_4_ = auVar125._20_4_ * 0.0;
        auVar165._24_4_ = auVar125._24_4_ * 0.0;
        auVar165._28_4_ = 0;
        auVar121 = vfmsub231ps_fma(auVar165,ZEXT1632(auVar25),auVar133);
        auVar46._4_4_ = auVar154._4_4_ * auVar133._4_4_;
        auVar46._0_4_ = auVar154._0_4_ * auVar133._0_4_;
        auVar46._8_4_ = auVar154._8_4_ * auVar133._8_4_;
        auVar46._12_4_ = auVar154._12_4_ * auVar133._12_4_;
        auVar46._16_4_ = auVar133._16_4_ * 0.0;
        auVar46._20_4_ = auVar133._20_4_ * 0.0;
        auVar46._24_4_ = auVar133._24_4_ * 0.0;
        auVar46._28_4_ = auVar133._28_4_;
        auVar203 = ZEXT1632(auVar154);
        auVar133 = vsubps_avx(ZEXT1632(auVar12),auVar203);
        auVar126 = ZEXT1632(auVar20);
        auVar20 = vfmsub231ps_fma(auVar46,auVar126,auVar133);
        auVar47._4_4_ = auVar25._4_4_ * auVar133._4_4_;
        auVar47._0_4_ = auVar25._0_4_ * auVar133._0_4_;
        auVar47._8_4_ = auVar25._8_4_ * auVar133._8_4_;
        auVar47._12_4_ = auVar25._12_4_ * auVar133._12_4_;
        auVar47._16_4_ = auVar133._16_4_ * 0.0;
        auVar47._20_4_ = auVar133._20_4_ * 0.0;
        auVar47._24_4_ = auVar133._24_4_ * 0.0;
        auVar47._28_4_ = auVar133._28_4_;
        auVar154 = vfmsub231ps_fma(auVar47,auVar203,auVar125);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar154),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar121));
        auVar142 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
        auVar125 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar21),auVar142);
        auVar133 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar9),auVar142);
        auVar132 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar11),auVar142);
        auVar147 = vblendvps_avx(auVar203,ZEXT1632(auVar12),auVar142);
        auVar221 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar13),auVar142);
        auVar22 = vblendvps_avx(auVar126,ZEXT1632(auVar7),auVar142);
        auVar203 = vblendvps_avx(ZEXT1632(auVar12),auVar203,auVar142);
        auVar149 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar25),auVar142);
        auVar20 = vpackssdw_avx(auVar210._0_16_,auVar210._16_16_);
        auVar126 = vblendvps_avx(ZEXT1632(auVar7),auVar126,auVar142);
        auVar164 = vsubps_avx(auVar203,auVar125);
        auVar149 = vsubps_avx(auVar149,auVar133);
        auVar187 = vsubps_avx(auVar126,auVar132);
        auVar197 = vsubps_avx(auVar125,auVar147);
        auVar199 = vsubps_avx(auVar133,auVar221);
        auVar200 = vsubps_avx(auVar132,auVar22);
        auVar48._4_4_ = auVar187._4_4_ * auVar125._4_4_;
        auVar48._0_4_ = auVar187._0_4_ * auVar125._0_4_;
        auVar48._8_4_ = auVar187._8_4_ * auVar125._8_4_;
        auVar48._12_4_ = auVar187._12_4_ * auVar125._12_4_;
        auVar48._16_4_ = auVar187._16_4_ * auVar125._16_4_;
        auVar48._20_4_ = auVar187._20_4_ * auVar125._20_4_;
        auVar48._24_4_ = auVar187._24_4_ * auVar125._24_4_;
        auVar48._28_4_ = auVar126._28_4_;
        auVar21 = vfmsub231ps_fma(auVar48,auVar132,auVar164);
        auVar49._4_4_ = auVar164._4_4_ * auVar133._4_4_;
        auVar49._0_4_ = auVar164._0_4_ * auVar133._0_4_;
        auVar49._8_4_ = auVar164._8_4_ * auVar133._8_4_;
        auVar49._12_4_ = auVar164._12_4_ * auVar133._12_4_;
        auVar49._16_4_ = auVar164._16_4_ * auVar133._16_4_;
        auVar49._20_4_ = auVar164._20_4_ * auVar133._20_4_;
        auVar49._24_4_ = auVar164._24_4_ * auVar133._24_4_;
        auVar49._28_4_ = auVar203._28_4_;
        auVar7 = vfmsub231ps_fma(auVar49,auVar125,auVar149);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        auVar129._0_4_ = auVar149._0_4_ * auVar132._0_4_;
        auVar129._4_4_ = auVar149._4_4_ * auVar132._4_4_;
        auVar129._8_4_ = auVar149._8_4_ * auVar132._8_4_;
        auVar129._12_4_ = auVar149._12_4_ * auVar132._12_4_;
        auVar129._16_4_ = auVar149._16_4_ * auVar132._16_4_;
        auVar129._20_4_ = auVar149._20_4_ * auVar132._20_4_;
        auVar129._24_4_ = auVar149._24_4_ * auVar132._24_4_;
        auVar129._28_4_ = 0;
        auVar7 = vfmsub231ps_fma(auVar129,auVar133,auVar187);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
        auVar171 = ZEXT1664(auVar7);
        auVar130._0_4_ = auVar200._0_4_ * auVar147._0_4_;
        auVar130._4_4_ = auVar200._4_4_ * auVar147._4_4_;
        auVar130._8_4_ = auVar200._8_4_ * auVar147._8_4_;
        auVar130._12_4_ = auVar200._12_4_ * auVar147._12_4_;
        auVar130._16_4_ = auVar200._16_4_ * auVar147._16_4_;
        auVar130._20_4_ = auVar200._20_4_ * auVar147._20_4_;
        auVar130._24_4_ = auVar200._24_4_ * auVar147._24_4_;
        auVar130._28_4_ = 0;
        auVar21 = vfmsub231ps_fma(auVar130,auVar197,auVar22);
        auVar50._4_4_ = auVar199._4_4_ * auVar22._4_4_;
        auVar50._0_4_ = auVar199._0_4_ * auVar22._0_4_;
        auVar50._8_4_ = auVar199._8_4_ * auVar22._8_4_;
        auVar50._12_4_ = auVar199._12_4_ * auVar22._12_4_;
        auVar50._16_4_ = auVar199._16_4_ * auVar22._16_4_;
        auVar50._20_4_ = auVar199._20_4_ * auVar22._20_4_;
        auVar50._24_4_ = auVar199._24_4_ * auVar22._24_4_;
        auVar50._28_4_ = auVar22._28_4_;
        auVar9 = vfmsub231ps_fma(auVar50,auVar221,auVar200);
        auVar51._4_4_ = auVar197._4_4_ * auVar221._4_4_;
        auVar51._0_4_ = auVar197._0_4_ * auVar221._0_4_;
        auVar51._8_4_ = auVar197._8_4_ * auVar221._8_4_;
        auVar51._12_4_ = auVar197._12_4_ * auVar221._12_4_;
        auVar51._16_4_ = auVar197._16_4_ * auVar221._16_4_;
        auVar51._20_4_ = auVar197._20_4_ * auVar221._20_4_;
        auVar51._24_4_ = auVar197._24_4_ * auVar221._24_4_;
        auVar51._28_4_ = auVar221._28_4_;
        auVar11 = vfmsub231ps_fma(auVar51,auVar199,auVar147);
        auVar221 = ZEXT832(0) << 0x20;
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar221,ZEXT1632(auVar21));
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar221,ZEXT1632(auVar9));
        auVar147 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar9));
        auVar147 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,2);
        auVar21 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
        auVar20 = vpand_avx(auVar20,auVar21);
        auVar147 = vpmovsxwd_avx2(auVar20);
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar147[0x1f]) {
LAB_019c826e:
          auVar179 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar193 = ZEXT3264(local_660);
          auVar213 = ZEXT3264(local_680);
        }
        else {
          auVar52._4_4_ = auVar149._4_4_ * auVar200._4_4_;
          auVar52._0_4_ = auVar149._0_4_ * auVar200._0_4_;
          auVar52._8_4_ = auVar149._8_4_ * auVar200._8_4_;
          auVar52._12_4_ = auVar149._12_4_ * auVar200._12_4_;
          auVar52._16_4_ = auVar149._16_4_ * auVar200._16_4_;
          auVar52._20_4_ = auVar149._20_4_ * auVar200._20_4_;
          auVar52._24_4_ = auVar149._24_4_ * auVar200._24_4_;
          auVar52._28_4_ = auVar147._28_4_;
          auVar13 = vfmsub231ps_fma(auVar52,auVar199,auVar187);
          auVar145._0_4_ = auVar197._0_4_ * auVar187._0_4_;
          auVar145._4_4_ = auVar197._4_4_ * auVar187._4_4_;
          auVar145._8_4_ = auVar197._8_4_ * auVar187._8_4_;
          auVar145._12_4_ = auVar197._12_4_ * auVar187._12_4_;
          auVar145._16_4_ = auVar197._16_4_ * auVar187._16_4_;
          auVar145._20_4_ = auVar197._20_4_ * auVar187._20_4_;
          auVar145._24_4_ = auVar197._24_4_ * auVar187._24_4_;
          auVar145._28_4_ = 0;
          auVar12 = vfmsub231ps_fma(auVar145,auVar164,auVar200);
          auVar53._4_4_ = auVar164._4_4_ * auVar199._4_4_;
          auVar53._0_4_ = auVar164._0_4_ * auVar199._0_4_;
          auVar53._8_4_ = auVar164._8_4_ * auVar199._8_4_;
          auVar53._12_4_ = auVar164._12_4_ * auVar199._12_4_;
          auVar53._16_4_ = auVar164._16_4_ * auVar199._16_4_;
          auVar53._20_4_ = auVar164._20_4_ * auVar199._20_4_;
          auVar53._24_4_ = auVar164._24_4_ * auVar199._24_4_;
          auVar53._28_4_ = auVar164._28_4_;
          auVar121 = vfmsub231ps_fma(auVar53,auVar197,auVar149);
          auVar21 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar121));
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar13),auVar221);
          auVar147 = vrcpps_avx(ZEXT1632(auVar11));
          auVar217._8_4_ = 0x3f800000;
          auVar217._0_8_ = &DAT_3f8000003f800000;
          auVar217._12_4_ = 0x3f800000;
          auVar217._16_4_ = 0x3f800000;
          auVar217._20_4_ = 0x3f800000;
          auVar217._24_4_ = 0x3f800000;
          auVar217._28_4_ = 0x3f800000;
          auVar21 = vfnmadd213ps_fma(auVar147,ZEXT1632(auVar11),auVar217);
          auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar147,auVar147);
          auVar54._4_4_ = auVar121._4_4_ * auVar132._4_4_;
          auVar54._0_4_ = auVar121._0_4_ * auVar132._0_4_;
          auVar54._8_4_ = auVar121._8_4_ * auVar132._8_4_;
          auVar54._12_4_ = auVar121._12_4_ * auVar132._12_4_;
          auVar54._16_4_ = auVar132._16_4_ * 0.0;
          auVar54._20_4_ = auVar132._20_4_ * 0.0;
          auVar54._24_4_ = auVar132._24_4_ * 0.0;
          auVar54._28_4_ = auVar132._28_4_;
          auVar12 = vfmadd231ps_fma(auVar54,auVar133,ZEXT1632(auVar12));
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar13),auVar125);
          fVar152 = auVar21._0_4_;
          fVar135 = auVar21._4_4_;
          fVar136 = auVar21._8_4_;
          fVar137 = auVar21._12_4_;
          auVar55._28_4_ = auVar133._28_4_;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar137 * auVar12._12_4_,
                                  CONCAT48(fVar136 * auVar12._8_4_,
                                           CONCAT44(fVar135 * auVar12._4_4_,fVar152 * auVar12._0_4_)
                                          )));
          auVar131._4_4_ = uVar112;
          auVar131._0_4_ = uVar112;
          auVar131._8_4_ = uVar112;
          auVar131._12_4_ = uVar112;
          auVar131._16_4_ = uVar112;
          auVar131._20_4_ = uVar112;
          auVar131._24_4_ = uVar112;
          auVar131._28_4_ = uVar112;
          uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar146._4_4_ = uVar119;
          auVar146._0_4_ = uVar119;
          auVar146._8_4_ = uVar119;
          auVar146._12_4_ = uVar119;
          auVar146._16_4_ = uVar119;
          auVar146._20_4_ = uVar119;
          auVar146._24_4_ = uVar119;
          auVar146._28_4_ = uVar119;
          auVar125 = vcmpps_avx(auVar131,auVar55,2);
          auVar133 = vcmpps_avx(auVar55,auVar146,2);
          auVar125 = vandps_avx(auVar133,auVar125);
          auVar21 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
          auVar20 = vpand_avx(auVar20,auVar21);
          auVar125 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar125 >> 0x7f,0) == '\0') &&
                (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0xbf,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar125[0x1f]) goto LAB_019c826e;
          auVar125 = vcmpps_avx(auVar221,ZEXT1632(auVar11),4);
          auVar21 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
          auVar20 = vpand_avx(auVar20,auVar21);
          auVar125 = vpmovsxwd_avx2(auVar20);
          auVar179 = ZEXT3264(CONCAT824(uStack_5c8,
                                        CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
          auVar193 = ZEXT3264(local_660);
          auVar213 = ZEXT3264(local_680);
          if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0x7f,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0xbf,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar125[0x1f] < '\0') {
            auVar132 = ZEXT1632(CONCAT412(fVar137 * auVar7._12_4_,
                                          CONCAT48(fVar136 * auVar7._8_4_,
                                                   CONCAT44(fVar135 * auVar7._4_4_,
                                                            fVar152 * auVar7._0_4_))));
            auVar147 = ZEXT1632(CONCAT412(fVar137 * auVar9._12_4_,
                                          CONCAT48(fVar136 * auVar9._8_4_,
                                                   CONCAT44(fVar135 * auVar9._4_4_,
                                                            fVar152 * auVar9._0_4_))));
            auVar188._8_4_ = 0x3f800000;
            auVar188._0_8_ = &DAT_3f8000003f800000;
            auVar188._12_4_ = 0x3f800000;
            auVar188._16_4_ = 0x3f800000;
            auVar188._20_4_ = 0x3f800000;
            auVar188._24_4_ = 0x3f800000;
            auVar188._28_4_ = 0x3f800000;
            auVar133 = vsubps_avx(auVar188,auVar132);
            auVar171 = ZEXT3264(auVar133);
            auVar133 = vblendvps_avx(auVar133,auVar132,auVar142);
            auVar193 = ZEXT3264(auVar133);
            auVar133 = vsubps_avx(auVar188,auVar147);
            local_4e0 = vblendvps_avx(auVar133,auVar147,auVar142);
            auVar179 = ZEXT3264(auVar125);
            auVar213 = ZEXT3264(auVar55);
          }
        }
        auVar228 = ZEXT3264(auVar176);
        local_660 = auVar193._0_32_;
        local_680 = auVar213._0_32_;
        auVar125 = auVar179._0_32_;
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0x7f,0) == '\0') &&
              (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar125 >> 0xbf,0) == '\0') &&
            (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar179[0x1f]) {
          bVar117 = false;
          auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,CONCAT416(
                                                  fVar218,CONCAT412(fVar218,CONCAT48(fVar218,
                                                  CONCAT44(fVar218,fVar218))))))));
          auVar179 = ZEXT3264(auVar176);
        }
        else {
          auVar133 = vsubps_avx(ZEXT1632(auVar8),auVar216);
          auVar20 = vfmadd213ps_fma(auVar133,local_660,auVar216);
          fVar152 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar56._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar152;
          auVar56._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar152;
          auVar56._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar152;
          auVar56._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar152;
          auVar56._16_4_ = fVar152 * 0.0;
          auVar56._20_4_ = fVar152 * 0.0;
          auVar56._24_4_ = fVar152 * 0.0;
          auVar56._28_4_ = 0;
          auVar133 = vcmpps_avx(local_680,auVar56,6);
          auVar132 = auVar125 & auVar133;
          auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,CONCAT416(
                                                  fVar218,CONCAT412(fVar218,CONCAT48(fVar218,
                                                  CONCAT44(fVar218,fVar218))))))));
          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar132 >> 0x7f,0) == '\0') &&
                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar132 >> 0xbf,0) == '\0') &&
              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar132[0x1f]) {
            auVar179 = ZEXT3264(auVar176);
            bVar117 = false;
          }
          else {
            local_3a0 = vandps_avx(auVar133,auVar125);
            auVar148._8_4_ = 0xbf800000;
            auVar148._0_8_ = 0xbf800000bf800000;
            auVar148._12_4_ = 0xbf800000;
            auVar148._16_4_ = 0xbf800000;
            auVar148._20_4_ = 0xbf800000;
            auVar148._24_4_ = 0xbf800000;
            auVar148._28_4_ = 0xbf800000;
            auVar166._8_4_ = 0x40000000;
            auVar166._0_8_ = 0x4000000040000000;
            auVar166._12_4_ = 0x40000000;
            auVar166._16_4_ = 0x40000000;
            auVar166._20_4_ = 0x40000000;
            auVar166._24_4_ = 0x40000000;
            auVar166._28_4_ = 0x40000000;
            auVar20 = vfmadd213ps_fma(local_4e0,auVar166,auVar148);
            local_440 = ZEXT1632(auVar20);
            local_400 = 0;
            local_3f0 = local_7d0;
            uStack_3e8 = uStack_7c8;
            local_3e0 = local_600._0_8_;
            uStack_3d8 = local_600._8_8_;
            local_3d0 = local_610._0_8_;
            uStack_3c8 = local_610._8_8_;
            auVar171 = ZEXT1664(local_620);
            auVar125 = local_680;
            local_4e0 = local_440;
            auVar133 = local_660;
            if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              bVar117 = false;
            }
            else {
              if (context->args->filter == (RTCFilterFunctionN)0x0) {
                auVar179 = ZEXT3264(auVar176);
                bVar117 = true;
                if (pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_019c7398;
              }
              fVar152 = 1.0 / auVar128._0_4_;
              auVar171 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar152,CONCAT420(fVar152,CONCAT416(
                                                  fVar152,CONCAT412(fVar152,CONCAT48(fVar152,
                                                  CONCAT44(fVar152,fVar152))))))));
              local_380[0] = fVar152 * (auVar193._0_4_ + 0.0);
              local_380[1] = fVar152 * (auVar193._4_4_ + 1.0);
              local_380[2] = fVar152 * (auVar193._8_4_ + 2.0);
              local_380[3] = fVar152 * (auVar193._12_4_ + 3.0);
              fStack_370 = fVar152 * (auVar193._16_4_ + 4.0);
              fStack_36c = fVar152 * (auVar193._20_4_ + 5.0);
              fStack_368 = fVar152 * (auVar193._24_4_ + 6.0);
              fStack_364 = auVar193._28_4_ + 7.0;
              local_4e0._0_8_ = auVar20._0_8_;
              local_4e0._8_8_ = auVar20._8_8_;
              local_360 = local_4e0._0_8_;
              uStack_358 = local_4e0._8_8_;
              uStack_350 = 0;
              uStack_348 = 0;
              local_340 = local_680;
              uVar112 = vmovmskps_avx(local_3a0);
              bVar117 = uVar112 != 0;
              if (bVar117) {
                uVar111 = 0;
                uVar115 = (ulong)(uVar112 & 0xff);
                for (uVar113 = uVar115; (uVar113 & 1) == 0;
                    uVar113 = uVar113 >> 1 | 0x8000000000000000) {
                  uVar111 = uVar111 + 1;
                }
                local_6c0._4_4_ = uVar15;
                local_6c0._0_4_ = uVar15;
                local_6c0._8_4_ = uVar15;
                local_6c0._12_4_ = uVar15;
                local_6c0._16_4_ = uVar15;
                local_6c0._20_4_ = uVar15;
                local_6c0._24_4_ = uVar15;
                local_6c0._28_4_ = uVar15;
                local_760._0_4_ = local_760._4_4_;
                local_760._8_4_ = local_760._4_4_;
                local_760._12_4_ = local_760._4_4_;
                auStack_750._0_4_ = local_760._4_4_;
                auStack_750._4_4_ = local_760._4_4_;
                auStack_750._8_4_ = local_760._4_4_;
                auStack_750._12_4_ = local_760._4_4_;
                auStack_6d0 = auVar168._16_16_;
                _local_6e0 = local_600;
                _auStack_6f0 = auVar23._16_16_;
                _local_700 = local_610;
                auStack_590 = auVar210._16_16_;
                _local_5a0 = local_620;
                local_780 = auVar176;
                uStack_730 = uVar120;
                uStack_728 = uVar120;
                local_460 = local_660;
                local_420 = local_680;
                local_3fc = iVar110;
                local_3c0 = local_620;
                local_740 = uVar120;
                uStack_738 = uVar120;
                do {
                  uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar152 = local_380[uVar111];
                  auVar123._4_4_ = fVar152;
                  auVar123._0_4_ = fVar152;
                  auVar123._8_4_ = fVar152;
                  auVar123._12_4_ = fVar152;
                  local_260._16_4_ = fVar152;
                  local_260._0_16_ = auVar123;
                  local_260._20_4_ = fVar152;
                  local_260._24_4_ = fVar152;
                  local_260._28_4_ = fVar152;
                  uVar4 = *(undefined4 *)((long)&local_360 + uVar111 * 4);
                  local_240._4_4_ = uVar4;
                  local_240._0_4_ = uVar4;
                  local_240._8_4_ = uVar4;
                  local_240._12_4_ = uVar4;
                  local_240._16_4_ = uVar4;
                  local_240._20_4_ = uVar4;
                  local_240._24_4_ = uVar4;
                  local_240._28_4_ = uVar4;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar111 * 4);
                  fVar135 = 1.0 - fVar152;
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar123,
                                            ZEXT416(0xc0a00000));
                  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * 3.0)),
                                            ZEXT416((uint)(fVar152 + fVar152)),auVar20);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar123,
                                            ZEXT416(0x40000000));
                  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar135 * fVar135 * -3.0)),
                                            ZEXT416((uint)(fVar135 + fVar135)),auVar20);
                  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar152 * (fVar135 + fVar135))),
                                            ZEXT416((uint)fVar135),ZEXT416((uint)fVar135));
                  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152)),auVar123,
                                           ZEXT416((uint)(fVar135 * -2.0)));
                  fVar152 = auVar20._0_4_ * 0.5;
                  fVar135 = auVar7._0_4_ * 0.5;
                  auVar182._0_4_ = fVar135 * (float)local_5a0._0_4_;
                  auVar182._4_4_ = fVar135 * (float)local_5a0._4_4_;
                  auVar182._8_4_ = fVar135 * fStack_598;
                  auVar182._12_4_ = fVar135 * fStack_594;
                  auVar157._4_4_ = fVar152;
                  auVar157._0_4_ = fVar152;
                  auVar157._8_4_ = fVar152;
                  auVar157._12_4_ = fVar152;
                  auVar20 = vfmadd132ps_fma(auVar157,auVar182,_local_700);
                  fVar152 = auVar21._0_4_ * 0.5;
                  auVar183._4_4_ = fVar152;
                  auVar183._0_4_ = fVar152;
                  auVar183._8_4_ = fVar152;
                  auVar183._12_4_ = fVar152;
                  auVar20 = vfmadd132ps_fma(auVar183,auVar20,_local_6e0);
                  local_7b0.context = context->user;
                  fVar152 = auVar8._0_4_ * 0.5;
                  auVar158._4_4_ = fVar152;
                  auVar158._0_4_ = fVar152;
                  auVar158._8_4_ = fVar152;
                  auVar158._12_4_ = fVar152;
                  auVar21 = vfmadd132ps_fma(auVar158,auVar20,auVar10);
                  local_2c0 = auVar21._0_4_;
                  uStack_2bc = local_2c0;
                  uStack_2b8 = local_2c0;
                  uStack_2b4 = local_2c0;
                  uStack_2b0 = local_2c0;
                  uStack_2ac = local_2c0;
                  uStack_2a8 = local_2c0;
                  uStack_2a4 = local_2c0;
                  auVar20 = vmovshdup_avx(auVar21);
                  local_2a0._8_8_ = auVar20._0_8_;
                  local_2a0._0_8_ = local_2a0._8_8_;
                  local_2a0._16_8_ = local_2a0._8_8_;
                  local_2a0._24_8_ = local_2a0._8_8_;
                  auVar20 = vshufps_avx(auVar21,auVar21,0xaa);
                  auVar159._0_8_ = auVar20._0_8_;
                  auVar159._8_8_ = auVar159._0_8_;
                  local_280._16_8_ = auVar159._0_8_;
                  local_280._0_16_ = auVar159;
                  local_280._24_8_ = auVar159._0_8_;
                  auVar171 = ZEXT3264(local_280);
                  local_220 = local_760._0_8_;
                  uStack_218 = local_760._8_8_;
                  uStack_210 = auStack_750._0_8_;
                  uStack_208 = auStack_750._8_8_;
                  local_200 = local_6c0;
                  auVar125 = vpcmpeqd_avx2(local_240,local_240);
                  local_1e0 = (local_7b0.context)->instID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = (local_7b0.context)->instPrimID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_640 = local_300._0_8_;
                  uStack_638 = local_300._8_8_;
                  uStack_630 = local_300._16_8_;
                  uStack_628 = local_300._24_8_;
                  local_7b0.valid = (int *)&local_640;
                  local_7b0.geometryUserPtr = pGVar16->userPtr;
                  local_7b0.hit = (RTCHitN *)&local_2c0;
                  local_7b0.N = 8;
                  local_7b0.ray = (RTCRayN *)ray;
                  if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar171 = ZEXT1664(auVar159);
                    (*pGVar16->occlusionFilterN)(&local_7b0);
                    auVar198._8_56_ = extraout_var;
                    auVar198._0_8_ = extraout_XMM1_Qa;
                    auVar228 = ZEXT3264(local_780);
                    auVar213 = ZEXT3264(local_680);
                    auVar193 = ZEXT3264(local_660);
                    auVar125 = vpcmpeqd_avx2(auVar198._0_32_,auVar198._0_32_);
                    uVar120 = local_740;
                    uVar224 = uStack_738;
                    uVar225 = uStack_730;
                    uVar226 = uStack_728;
                  }
                  auVar101._8_8_ = uStack_638;
                  auVar101._0_8_ = local_640;
                  auVar101._16_8_ = uStack_630;
                  auVar101._24_8_ = uStack_628;
                  auVar132 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar101);
                  auVar133 = auVar125 & ~auVar132;
                  auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,
                                                  CONCAT416(fVar218,CONCAT412(fVar218,CONCAT48(
                                                  fVar218,CONCAT44(fVar218,fVar218))))))));
                  if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar133 >> 0x7f,0) == '\0') &&
                        (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar133 >> 0xbf,0) == '\0') &&
                      (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar133[0x1f]) {
                    auVar132 = auVar132 ^ auVar125;
                  }
                  else {
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var19)(&local_7b0);
                      auVar228 = ZEXT3264(local_780);
                      auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,
                                                  CONCAT416(fVar218,CONCAT412(fVar218,CONCAT48(
                                                  fVar218,CONCAT44(fVar218,fVar218))))))));
                      auVar213 = ZEXT3264(local_680);
                      auVar193 = ZEXT3264(local_660);
                      uVar120 = local_740;
                      uVar224 = uStack_738;
                      uVar225 = uStack_730;
                      uVar226 = uStack_728;
                    }
                    auVar102._8_8_ = uStack_638;
                    auVar102._0_8_ = local_640;
                    auVar102._16_8_ = uStack_630;
                    auVar102._24_8_ = uStack_628;
                    auVar133 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                    auVar125 = vpcmpeqd_avx2(auVar133,auVar102);
                    auVar132 = vpcmpeqd_avx2(auVar133,auVar133);
                    auVar132 = auVar125 ^ auVar132;
                    auVar167._8_4_ = 0xff800000;
                    auVar167._0_8_ = 0xff800000ff800000;
                    auVar167._12_4_ = 0xff800000;
                    auVar167._16_4_ = 0xff800000;
                    auVar167._20_4_ = 0xff800000;
                    auVar167._24_4_ = 0xff800000;
                    auVar167._28_4_ = 0xff800000;
                    auVar171 = ZEXT3264(auVar167);
                    auVar125 = vblendvps_avx(auVar167,*(undefined1 (*) [32])(local_7b0.ray + 0x100),
                                             auVar125);
                    *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar125;
                  }
                  auVar176 = auVar228._0_32_;
                  auVar125 = auVar213._0_32_;
                  auVar133 = auVar193._0_32_;
                  if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar132 >> 0x7f,0) != '\0') ||
                        (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar132 >> 0xbf,0) != '\0') ||
                      (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar132[0x1f] < '\0') break;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar119;
                  uVar113 = uVar111 & 0x3f;
                  uVar111 = 0;
                  uVar115 = uVar115 ^ 1L << uVar113;
                  for (uVar113 = uVar115; (uVar113 & 1) == 0;
                      uVar113 = uVar113 >> 1 | 0x8000000000000000) {
                    uVar111 = uVar111 + 1;
                  }
                  bVar117 = uVar115 != 0;
                } while (bVar117);
              }
            }
            local_660 = auVar133;
            local_680 = auVar125;
            auVar179 = ZEXT3264(auVar176);
          }
        }
      }
LAB_019c7398:
      auVar213 = ZEXT3264(auVar201);
      if (8 < iVar110) {
        local_5a0._4_4_ = iVar110;
        local_5a0._0_4_ = iVar110;
        fStack_598 = (float)iVar110;
        fStack_594 = (float)iVar110;
        auStack_590._0_4_ = iVar110;
        auStack_590._4_4_ = iVar110;
        auStack_590._8_4_ = iVar110;
        auStack_590._12_4_ = iVar110;
        local_120 = fVar153;
        fStack_11c = fVar153;
        fStack_118 = fVar153;
        fStack_114 = fVar153;
        fStack_110 = fVar153;
        fStack_10c = fVar153;
        fStack_108 = fVar153;
        fStack_104 = fVar153;
        local_140 = local_720._0_4_;
        uStack_13c = local_720._0_4_;
        uStack_138 = local_720._0_4_;
        uStack_134 = local_720._0_4_;
        uStack_130 = local_720._0_4_;
        uStack_12c = local_720._0_4_;
        uStack_128 = local_720._0_4_;
        uStack_124 = local_720._0_4_;
        local_1a0 = 1.0 / (float)local_560._0_4_;
        fStack_19c = local_1a0;
        fStack_198 = local_1a0;
        fStack_194 = local_1a0;
        fStack_190 = local_1a0;
        fStack_18c = local_1a0;
        fStack_188 = local_1a0;
        fStack_184 = local_1a0;
        local_160 = uVar15;
        uStack_15c = uVar15;
        uStack_158 = uVar15;
        uStack_154 = uVar15;
        uStack_150 = uVar15;
        uStack_14c = uVar15;
        uStack_148 = uVar15;
        uStack_144 = uVar15;
        local_180 = local_580._0_4_;
        uStack_17c = local_580._0_4_;
        uStack_178 = local_580._0_4_;
        uStack_174 = local_580._0_4_;
        uStack_170 = local_580._0_4_;
        uStack_16c = local_580._0_4_;
        uStack_168 = local_580._0_4_;
        uStack_164 = local_580._0_4_;
        lVar116 = 8;
        auVar193 = ZEXT3264(local_6a0);
        local_780 = auVar179._0_32_;
        uStack_738 = uVar224;
        local_740 = uVar120;
        uStack_730 = uVar225;
        uStack_728 = uVar226;
        do {
          auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar116 * 4 + lVar24);
          auVar133 = *(undefined1 (*) [32])(lVar24 + 0x22307f0 + lVar116 * 4);
          local_720 = *(undefined1 (*) [32])(lVar24 + 0x2230c74 + lVar116 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar24 + 0x22310f8 + lVar116 * 4);
          auVar107 = *pauVar2;
          auVar180._0_4_ = auVar198._0_4_ * *(float *)*pauVar2;
          auVar180._4_4_ = auVar198._4_4_ * *(float *)(*pauVar2 + 4);
          auVar180._8_4_ = auVar198._8_4_ * *(float *)(*pauVar2 + 8);
          auVar180._12_4_ = auVar198._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar180._16_4_ = auVar198._16_4_ * *(float *)(*pauVar2 + 0x10);
          auVar180._20_4_ = auVar198._20_4_ * *(float *)(*pauVar2 + 0x14);
          auVar180._28_36_ = auVar179._28_36_;
          auVar180._24_4_ = auVar198._24_4_ * *(float *)(*pauVar2 + 0x18);
          auVar228._0_4_ = fVar229 * *(float *)*pauVar2;
          auVar228._4_4_ = fVar231 * *(float *)(*pauVar2 + 4);
          auVar228._8_4_ = fVar229 * *(float *)(*pauVar2 + 8);
          auVar228._12_4_ = fVar231 * *(float *)(*pauVar2 + 0xc);
          auVar228._16_4_ = fVar229 * *(float *)(*pauVar2 + 0x10);
          auVar228._20_4_ = fVar231 * *(float *)(*pauVar2 + 0x14);
          auVar228._28_36_ = auVar171._28_36_;
          auVar228._24_4_ = fVar229 * *(float *)(*pauVar2 + 0x18);
          auVar20 = vfmadd231ps_fma(auVar180._0_32_,local_720,auVar163);
          auVar197 = auVar213._0_32_;
          auVar21 = vfmadd231ps_fma(auVar228._0_32_,local_720,auVar197);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar133,auVar175);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar133,auVar193._0_32_);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar125,auVar189);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar125,local_4a0);
          auVar132 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar116 * 4 + lVar24);
          auVar147 = *(undefined1 (*) [32])(lVar24 + 0x2232c10 + lVar116 * 4);
          auVar221 = *(undefined1 (*) [32])(lVar24 + 0x2233094 + lVar116 * 4);
          pfVar1 = (float *)(lVar24 + 0x2233518 + lVar116 * 4);
          fVar140 = *pfVar1;
          fVar219 = pfVar1[1];
          fVar223 = pfVar1[2];
          fVar88 = pfVar1[3];
          fVar89 = pfVar1[4];
          fVar90 = pfVar1[5];
          fVar91 = pfVar1[6];
          auVar57._4_4_ = fVar219 * auVar198._4_4_;
          auVar57._0_4_ = fVar140 * auVar198._0_4_;
          auVar57._8_4_ = fVar223 * auVar198._8_4_;
          auVar57._12_4_ = fVar88 * auVar198._12_4_;
          auVar57._16_4_ = fVar89 * auVar198._16_4_;
          auVar57._20_4_ = fVar90 * auVar198._20_4_;
          auVar57._24_4_ = fVar91 * auVar198._24_4_;
          auVar57._28_4_ = auVar125._28_4_;
          auVar213._0_4_ = fVar140 * fVar229;
          auVar213._4_4_ = fVar219 * fVar231;
          auVar213._8_4_ = fVar223 * fVar229;
          auVar213._12_4_ = fVar88 * fVar231;
          auVar213._16_4_ = fVar89 * fVar229;
          auVar213._20_4_ = fVar90 * fVar231;
          auVar213._28_36_ = auVar198._28_36_;
          auVar213._24_4_ = fVar91 * fVar229;
          auVar7 = vfmadd231ps_fma(auVar57,auVar221,auVar163);
          auVar8 = vfmadd231ps_fma(auVar213._0_32_,auVar221,auVar197);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar147,auVar175);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar147,auVar193._0_32_);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar132,auVar189);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar132,local_4a0);
          _local_700 = ZEXT1632(auVar7);
          auVar142 = ZEXT1632(auVar20);
          auVar203 = vsubps_avx(_local_700,auVar142);
          auVar164 = ZEXT1632(auVar8);
          auVar126 = ZEXT1632(auVar21);
          auVar210 = vsubps_avx(auVar164,auVar126);
          auVar58._4_4_ = auVar21._4_4_ * auVar203._4_4_;
          auVar58._0_4_ = auVar21._0_4_ * auVar203._0_4_;
          auVar58._8_4_ = auVar21._8_4_ * auVar203._8_4_;
          auVar58._12_4_ = auVar21._12_4_ * auVar203._12_4_;
          auVar58._16_4_ = auVar203._16_4_ * 0.0;
          auVar58._20_4_ = auVar203._20_4_ * 0.0;
          auVar58._24_4_ = auVar203._24_4_ * 0.0;
          auVar58._28_4_ = auVar193._28_4_;
          fVar153 = auVar210._0_4_;
          fVar152 = auVar210._4_4_;
          auVar108._4_4_ = auVar20._4_4_ * fVar152;
          auVar108._0_4_ = auVar20._0_4_ * fVar153;
          fVar135 = auVar210._8_4_;
          auVar108._8_4_ = auVar20._8_4_ * fVar135;
          fVar136 = auVar210._12_4_;
          auVar108._12_4_ = auVar20._12_4_ * fVar136;
          fVar137 = auVar210._16_4_;
          auVar108._16_4_ = fVar137 * 0.0;
          fVar138 = auVar210._20_4_;
          auVar108._20_4_ = fVar138 * 0.0;
          fVar139 = auVar210._24_4_;
          auVar108._24_4_ = fVar139 * 0.0;
          auVar108._28_4_ = uVar214;
          auVar23 = vsubps_avx(auVar58,auVar108);
          local_880 = auVar107._0_4_;
          fStack_87c = auVar107._4_4_;
          fStack_878 = auVar107._8_4_;
          fStack_874 = auVar107._12_4_;
          fStack_870 = auVar107._16_4_;
          fStack_86c = auVar107._20_4_;
          fStack_868 = auVar107._24_4_;
          auVar59._4_4_ = local_100._4_4_ * fStack_87c;
          auVar59._0_4_ = (float)local_100 * local_880;
          auVar59._8_4_ = (float)uStack_f8 * fStack_878;
          auVar59._12_4_ = uStack_f8._4_4_ * fStack_874;
          auVar59._16_4_ = (float)uStack_f0 * fStack_870;
          auVar59._20_4_ = uStack_f0._4_4_ * fStack_86c;
          auVar59._24_4_ = (float)uStack_e8 * fStack_868;
          auVar59._28_4_ = uVar214;
          auVar20 = vfmadd231ps_fma(auVar59,local_e0,local_720);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_c0,auVar133);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_a0,auVar125);
          auVar60._4_4_ = local_100._4_4_ * fVar219;
          auVar60._0_4_ = (float)local_100 * fVar140;
          auVar60._8_4_ = (float)uStack_f8 * fVar223;
          auVar60._12_4_ = uStack_f8._4_4_ * fVar88;
          auVar60._16_4_ = (float)uStack_f0 * fVar89;
          auVar60._20_4_ = uStack_f0._4_4_ * fVar90;
          auVar60._24_4_ = (float)uStack_e8 * fVar91;
          auVar60._28_4_ = uStack_e8._4_4_;
          auVar21 = vfmadd231ps_fma(auVar60,auVar221,local_e0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar147,local_c0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar132,local_a0);
          auVar187 = ZEXT1632(auVar21);
          auVar171 = ZEXT3264(auVar187);
          auVar193 = ZEXT3264(local_6a0);
          auVar207._0_4_ = fVar153 * fVar153;
          auVar207._4_4_ = fVar152 * fVar152;
          auVar207._8_4_ = fVar135 * fVar135;
          auVar207._12_4_ = fVar136 * fVar136;
          auVar207._16_4_ = fVar137 * fVar137;
          auVar207._20_4_ = fVar138 * fVar138;
          auVar207._24_4_ = fVar139 * fVar139;
          auVar207._28_4_ = 0;
          auVar21 = vfmadd231ps_fma(auVar207,auVar203,auVar203);
          auVar149 = ZEXT1632(auVar20);
          auVar22 = vmaxps_avx(auVar149,auVar187);
          auVar208._0_4_ = auVar22._0_4_ * auVar22._0_4_ * auVar21._0_4_;
          auVar208._4_4_ = auVar22._4_4_ * auVar22._4_4_ * auVar21._4_4_;
          auVar208._8_4_ = auVar22._8_4_ * auVar22._8_4_ * auVar21._8_4_;
          auVar208._12_4_ = auVar22._12_4_ * auVar22._12_4_ * auVar21._12_4_;
          auVar208._16_4_ = auVar22._16_4_ * auVar22._16_4_ * 0.0;
          auVar208._20_4_ = auVar22._20_4_ * auVar22._20_4_ * 0.0;
          auVar208._24_4_ = auVar22._24_4_ * auVar22._24_4_ * 0.0;
          auVar208._28_4_ = 0;
          auVar61._4_4_ = auVar23._4_4_ * auVar23._4_4_;
          auVar61._0_4_ = auVar23._0_4_ * auVar23._0_4_;
          auVar61._8_4_ = auVar23._8_4_ * auVar23._8_4_;
          auVar61._12_4_ = auVar23._12_4_ * auVar23._12_4_;
          auVar61._16_4_ = auVar23._16_4_ * auVar23._16_4_;
          auVar61._20_4_ = auVar23._20_4_ * auVar23._20_4_;
          auVar61._24_4_ = auVar23._24_4_ * auVar23._24_4_;
          auVar61._28_4_ = auVar23._28_4_;
          auVar22 = vcmpps_avx(auVar61,auVar208,2);
          auVar179 = ZEXT3264(auVar22);
          local_400 = (int)lVar116;
          auVar209._4_4_ = local_400;
          auVar209._0_4_ = local_400;
          auVar209._8_4_ = local_400;
          auVar209._12_4_ = local_400;
          auVar209._16_4_ = local_400;
          auVar209._20_4_ = local_400;
          auVar209._24_4_ = local_400;
          auVar209._28_4_ = local_400;
          auVar23 = vpor_avx2(auVar209,_DAT_0205a920);
          auVar168 = vpcmpgtd_avx2(_local_5a0,auVar23);
          auVar23 = auVar168 & auVar22;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) {
            auVar213 = ZEXT3264(auVar197);
            auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,CONCAT416(
                                                  fVar218,CONCAT412(fVar218,CONCAT48(fVar218,
                                                  CONCAT44(fVar218,fVar218))))))));
          }
          else {
            local_4c0 = vandps_avx(auVar168,auVar22);
            auVar62._4_4_ = local_740._4_4_ * fVar219;
            auVar62._0_4_ = (float)local_740 * fVar140;
            auVar62._8_4_ = (float)uStack_738 * fVar223;
            auVar62._12_4_ = uStack_738._4_4_ * fVar88;
            auVar62._16_4_ = (float)uStack_730 * fVar89;
            auVar62._20_4_ = uStack_730._4_4_ * fVar90;
            auVar62._24_4_ = (float)uStack_728 * fVar91;
            auVar62._28_4_ = auVar22._28_4_;
            auVar20 = vfmadd213ps_fma(auVar221,local_520,auVar62);
            auVar20 = vfmadd213ps_fma(auVar147,local_780,ZEXT1632(auVar20));
            auVar20 = vfmadd132ps_fma(auVar132,ZEXT1632(auVar20),local_5c0);
            auVar63._4_4_ = local_740._4_4_ * fStack_87c;
            auVar63._0_4_ = (float)local_740 * local_880;
            auVar63._8_4_ = (float)uStack_738 * fStack_878;
            auVar63._12_4_ = uStack_738._4_4_ * fStack_874;
            auVar63._16_4_ = (float)uStack_730 * fStack_870;
            auVar63._20_4_ = uStack_730._4_4_ * fStack_86c;
            auVar63._24_4_ = (float)uStack_728 * fStack_868;
            auVar63._28_4_ = auVar22._28_4_;
            auVar21 = vfmadd213ps_fma(local_720,local_520,auVar63);
            auVar21 = vfmadd213ps_fma(auVar133,local_780,ZEXT1632(auVar21));
            auVar133 = *(undefined1 (*) [32])(lVar24 + 0x223157c + lVar116 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar24 + 0x2231a00 + lVar116 * 4);
            auVar147 = *(undefined1 (*) [32])(lVar24 + 0x2231e84 + lVar116 * 4);
            pfVar3 = (float *)(lVar24 + 0x2232308 + lVar116 * 4);
            fVar153 = *pfVar3;
            fVar152 = pfVar3[1];
            fVar135 = pfVar3[2];
            fVar136 = pfVar3[3];
            fVar137 = pfVar3[4];
            fVar138 = pfVar3[5];
            fVar139 = pfVar3[6];
            auVar64._4_4_ = fVar152 * fVar218;
            auVar64._0_4_ = fVar153 * fVar218;
            auVar64._8_4_ = fVar135 * fVar218;
            auVar64._12_4_ = fVar136 * fVar218;
            auVar64._16_4_ = fVar137 * fVar218;
            auVar64._20_4_ = fVar138 * fVar218;
            auVar64._24_4_ = fVar139 * fVar218;
            auVar64._28_4_ = local_4a0._28_4_;
            auVar65._4_4_ = fVar231 * fVar152;
            auVar65._0_4_ = fVar229 * fVar153;
            auVar65._8_4_ = fVar229 * fVar135;
            auVar65._12_4_ = fVar231 * fVar136;
            auVar65._16_4_ = fVar229 * fVar137;
            auVar65._20_4_ = fVar231 * fVar138;
            auVar65._24_4_ = fVar229 * fVar139;
            auVar65._28_4_ = pfVar1[7];
            auVar66._4_4_ = local_740._4_4_ * fVar152;
            auVar66._0_4_ = (float)local_740 * fVar153;
            auVar66._8_4_ = (float)uStack_738 * fVar135;
            auVar66._12_4_ = uStack_738._4_4_ * fVar136;
            auVar66._16_4_ = (float)uStack_730 * fVar137;
            auVar66._20_4_ = uStack_730._4_4_ * fVar138;
            auVar66._24_4_ = (float)uStack_728 * fVar139;
            auVar66._28_4_ = pfVar3[7];
            auVar7 = vfmadd231ps_fma(auVar64,auVar147,auVar163);
            auVar8 = vfmadd231ps_fma(auVar65,auVar147,auVar197);
            auVar9 = vfmadd231ps_fma(auVar66,local_520,auVar147);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar132,auVar175);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar132,local_6a0);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_780,auVar132);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar133,auVar189);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar133,local_4a0);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar133,local_5c0);
            pfVar1 = (float *)(lVar24 + 0x2234728 + lVar116 * 4);
            fVar153 = *pfVar1;
            fVar152 = pfVar1[1];
            fVar135 = pfVar1[2];
            fVar136 = pfVar1[3];
            fVar137 = pfVar1[4];
            fVar138 = pfVar1[5];
            fVar139 = pfVar1[6];
            auVar67._4_4_ = fVar218 * fVar152;
            auVar67._0_4_ = fVar218 * fVar153;
            auVar67._8_4_ = fVar218 * fVar135;
            auVar67._12_4_ = fVar218 * fVar136;
            auVar67._16_4_ = fVar218 * fVar137;
            auVar67._20_4_ = fVar218 * fVar138;
            auVar67._24_4_ = fVar218 * fVar139;
            auVar67._28_4_ = local_780._28_4_;
            auVar68._4_4_ = fVar231 * fVar152;
            auVar68._0_4_ = fVar229 * fVar153;
            auVar68._8_4_ = fVar229 * fVar135;
            auVar68._12_4_ = fVar231 * fVar136;
            auVar68._16_4_ = fVar229 * fVar137;
            auVar68._20_4_ = fVar231 * fVar138;
            auVar68._24_4_ = fVar229 * fVar139;
            auVar68._28_4_ = fVar231;
            auVar69._4_4_ = local_740._4_4_ * fVar152;
            auVar69._0_4_ = (float)local_740 * fVar153;
            auVar69._8_4_ = (float)uStack_738 * fVar135;
            auVar69._12_4_ = uStack_738._4_4_ * fVar136;
            auVar69._16_4_ = (float)uStack_730 * fVar137;
            auVar69._20_4_ = uStack_730._4_4_ * fVar138;
            auVar69._24_4_ = (float)uStack_728 * fVar139;
            auVar69._28_4_ = pfVar1[7];
            auVar133 = *(undefined1 (*) [32])(lVar24 + 0x22342a4 + lVar116 * 4);
            auVar11 = vfmadd231ps_fma(auVar67,auVar133,auVar163);
            auVar12 = vfmadd231ps_fma(auVar68,auVar133,auVar197);
            auVar13 = vfmadd231ps_fma(auVar69,local_520,auVar133);
            auVar133 = *(undefined1 (*) [32])(lVar24 + 0x2233e20 + lVar116 * 4);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar133,auVar175);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar133,local_6a0);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar133,local_780);
            auVar133 = *(undefined1 (*) [32])(lVar24 + 0x223399c + lVar116 * 4);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar133,auVar189);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar133,local_4a0);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_5c0,auVar133);
            auVar133 = vandps_avx(ZEXT1632(auVar7),local_2e0);
            auVar132 = vandps_avx(ZEXT1632(auVar8),local_2e0);
            auVar132 = vmaxps_avx(auVar133,auVar132);
            auVar133 = vandps_avx(ZEXT1632(auVar9),local_2e0);
            auVar133 = vmaxps_avx(auVar132,auVar133);
            auVar106._4_4_ = fStack_11c;
            auVar106._0_4_ = local_120;
            auVar106._8_4_ = fStack_118;
            auVar106._12_4_ = fStack_114;
            auVar106._16_4_ = fStack_110;
            auVar106._20_4_ = fStack_10c;
            auVar106._24_4_ = fStack_108;
            auVar106._28_4_ = fStack_104;
            auVar133 = vcmpps_avx(auVar133,auVar106,1);
            auVar147 = vblendvps_avx(ZEXT1632(auVar7),auVar203,auVar133);
            auVar221 = vblendvps_avx(ZEXT1632(auVar8),auVar210,auVar133);
            auVar133 = vandps_avx(ZEXT1632(auVar11),local_2e0);
            auVar132 = vandps_avx(ZEXT1632(auVar12),local_2e0);
            auVar132 = vmaxps_avx(auVar133,auVar132);
            auVar133 = vandps_avx(local_2e0,ZEXT1632(auVar13));
            auVar133 = vmaxps_avx(auVar132,auVar133);
            auVar132 = vcmpps_avx(auVar133,auVar106,1);
            auVar133 = vblendvps_avx(ZEXT1632(auVar11),auVar203,auVar132);
            auVar132 = vblendvps_avx(ZEXT1632(auVar12),auVar210,auVar132);
            auVar21 = vfmadd213ps_fma(auVar125,local_5c0,ZEXT1632(auVar21));
            auVar7 = vfmadd213ps_fma(auVar147,auVar147,ZEXT832(0) << 0x20);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar221,auVar221);
            auVar125 = vrsqrtps_avx(ZEXT1632(auVar7));
            fVar153 = auVar125._0_4_;
            fVar152 = auVar125._4_4_;
            fVar135 = auVar125._8_4_;
            fVar136 = auVar125._12_4_;
            fVar137 = auVar125._16_4_;
            fVar138 = auVar125._20_4_;
            fVar139 = auVar125._24_4_;
            auVar70._4_4_ = fVar152 * fVar152 * fVar152 * auVar7._4_4_ * -0.5;
            auVar70._0_4_ = fVar153 * fVar153 * fVar153 * auVar7._0_4_ * -0.5;
            auVar70._8_4_ = fVar135 * fVar135 * fVar135 * auVar7._8_4_ * -0.5;
            auVar70._12_4_ = fVar136 * fVar136 * fVar136 * auVar7._12_4_ * -0.5;
            auVar70._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
            auVar70._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar70._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
            auVar70._28_4_ = 0;
            auVar150._8_4_ = 0x3fc00000;
            auVar150._0_8_ = 0x3fc000003fc00000;
            auVar150._12_4_ = 0x3fc00000;
            auVar150._16_4_ = 0x3fc00000;
            auVar150._20_4_ = 0x3fc00000;
            auVar150._24_4_ = 0x3fc00000;
            auVar150._28_4_ = 0x3fc00000;
            auVar7 = vfmadd231ps_fma(auVar70,auVar150,auVar125);
            fVar153 = auVar7._0_4_;
            fVar152 = auVar7._4_4_;
            auVar71._4_4_ = auVar221._4_4_ * fVar152;
            auVar71._0_4_ = auVar221._0_4_ * fVar153;
            fVar135 = auVar7._8_4_;
            auVar71._8_4_ = auVar221._8_4_ * fVar135;
            fVar136 = auVar7._12_4_;
            auVar71._12_4_ = auVar221._12_4_ * fVar136;
            auVar71._16_4_ = auVar221._16_4_ * 0.0;
            auVar71._20_4_ = auVar221._20_4_ * 0.0;
            auVar71._24_4_ = auVar221._24_4_ * 0.0;
            auVar71._28_4_ = auVar221._28_4_;
            auVar72._4_4_ = fVar152 * -auVar147._4_4_;
            auVar72._0_4_ = fVar153 * -auVar147._0_4_;
            auVar72._8_4_ = fVar135 * -auVar147._8_4_;
            auVar72._12_4_ = fVar136 * -auVar147._12_4_;
            auVar72._16_4_ = -auVar147._16_4_ * 0.0;
            auVar72._20_4_ = -auVar147._20_4_ * 0.0;
            auVar72._24_4_ = -auVar147._24_4_ * 0.0;
            auVar72._28_4_ = auVar125._28_4_;
            auVar7 = vfmadd213ps_fma(auVar133,auVar133,ZEXT832(0) << 0x20);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar132,auVar132);
            auVar125 = vrsqrtps_avx(ZEXT1632(auVar7));
            auVar73._28_4_ = fVar218;
            auVar73._0_28_ =
                 ZEXT1628(CONCAT412(fVar136 * 0.0,
                                    CONCAT48(fVar135 * 0.0,CONCAT44(fVar152 * 0.0,fVar153 * 0.0))));
            fVar153 = auVar125._0_4_;
            fVar152 = auVar125._4_4_;
            fVar135 = auVar125._8_4_;
            fVar136 = auVar125._12_4_;
            fVar137 = auVar125._16_4_;
            fVar138 = auVar125._20_4_;
            fVar139 = auVar125._24_4_;
            auVar74._4_4_ = fVar152 * fVar152 * fVar152 * auVar7._4_4_ * -0.5;
            auVar74._0_4_ = fVar153 * fVar153 * fVar153 * auVar7._0_4_ * -0.5;
            auVar74._8_4_ = fVar135 * fVar135 * fVar135 * auVar7._8_4_ * -0.5;
            auVar74._12_4_ = fVar136 * fVar136 * fVar136 * auVar7._12_4_ * -0.5;
            auVar74._16_4_ = fVar137 * fVar137 * fVar137 * -0.0;
            auVar74._20_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar74._24_4_ = fVar139 * fVar139 * fVar139 * -0.0;
            auVar74._28_4_ = 0;
            auVar7 = vfmadd231ps_fma(auVar74,auVar150,auVar125);
            fVar153 = auVar7._0_4_;
            fVar152 = auVar7._4_4_;
            auVar75._4_4_ = auVar132._4_4_ * fVar152;
            auVar75._0_4_ = auVar132._0_4_ * fVar153;
            fVar135 = auVar7._8_4_;
            auVar75._8_4_ = auVar132._8_4_ * fVar135;
            fVar136 = auVar7._12_4_;
            auVar75._12_4_ = auVar132._12_4_ * fVar136;
            auVar75._16_4_ = auVar132._16_4_ * 0.0;
            auVar75._20_4_ = auVar132._20_4_ * 0.0;
            auVar75._24_4_ = auVar132._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar76._4_4_ = fVar152 * -auVar133._4_4_;
            auVar76._0_4_ = fVar153 * -auVar133._0_4_;
            auVar76._8_4_ = fVar135 * -auVar133._8_4_;
            auVar76._12_4_ = fVar136 * -auVar133._12_4_;
            auVar76._16_4_ = -auVar133._16_4_ * 0.0;
            auVar76._20_4_ = -auVar133._20_4_ * 0.0;
            auVar76._24_4_ = -auVar133._24_4_ * 0.0;
            auVar76._28_4_ = 0;
            auVar77._28_4_ = 0xbf000000;
            auVar77._0_28_ =
                 ZEXT1628(CONCAT412(fVar136 * 0.0,
                                    CONCAT48(fVar135 * 0.0,CONCAT44(fVar152 * 0.0,fVar153 * 0.0))));
            auVar7 = vfmadd213ps_fma(auVar71,auVar149,auVar142);
            auVar8 = vfmadd213ps_fma(auVar72,auVar149,auVar126);
            auVar9 = vfmadd213ps_fma(auVar73,auVar149,ZEXT1632(auVar21));
            auVar121 = vfnmadd213ps_fma(auVar71,auVar149,auVar142);
            auVar11 = vfmadd213ps_fma(auVar75,auVar187,_local_700);
            auVar154 = vfnmadd213ps_fma(auVar72,auVar149,auVar126);
            auVar12 = vfmadd213ps_fma(auVar76,auVar187,auVar164);
            auVar155 = vfnmadd231ps_fma(ZEXT1632(auVar21),auVar149,auVar73);
            auVar21 = vfmadd213ps_fma(auVar77,auVar187,ZEXT1632(auVar20));
            auVar25 = vfnmadd213ps_fma(auVar75,auVar187,_local_700);
            auVar122 = vfnmadd213ps_fma(auVar76,auVar187,auVar164);
            auVar156 = vfnmadd231ps_fma(ZEXT1632(auVar20),auVar187,auVar77);
            auVar125 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar154));
            auVar133 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar155));
            auVar78._4_4_ = auVar125._4_4_ * auVar155._4_4_;
            auVar78._0_4_ = auVar125._0_4_ * auVar155._0_4_;
            auVar78._8_4_ = auVar125._8_4_ * auVar155._8_4_;
            auVar78._12_4_ = auVar125._12_4_ * auVar155._12_4_;
            auVar78._16_4_ = auVar125._16_4_ * 0.0;
            auVar78._20_4_ = auVar125._20_4_ * 0.0;
            auVar78._24_4_ = auVar125._24_4_ * 0.0;
            auVar78._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar78,ZEXT1632(auVar154),auVar133);
            auVar79._4_4_ = auVar121._4_4_ * auVar133._4_4_;
            auVar79._0_4_ = auVar121._0_4_ * auVar133._0_4_;
            auVar79._8_4_ = auVar121._8_4_ * auVar133._8_4_;
            auVar79._12_4_ = auVar121._12_4_ * auVar133._12_4_;
            auVar79._16_4_ = auVar133._16_4_ * 0.0;
            auVar79._20_4_ = auVar133._20_4_ * 0.0;
            auVar79._24_4_ = auVar133._24_4_ * 0.0;
            auVar79._28_4_ = auVar133._28_4_;
            auVar210 = ZEXT1632(auVar121);
            auVar133 = vsubps_avx(ZEXT1632(auVar11),auVar210);
            auVar168 = ZEXT1632(auVar155);
            auVar20 = vfmsub231ps_fma(auVar79,auVar168,auVar133);
            auVar80._4_4_ = auVar154._4_4_ * auVar133._4_4_;
            auVar80._0_4_ = auVar154._0_4_ * auVar133._0_4_;
            auVar80._8_4_ = auVar154._8_4_ * auVar133._8_4_;
            auVar80._12_4_ = auVar154._12_4_ * auVar133._12_4_;
            auVar80._16_4_ = auVar133._16_4_ * 0.0;
            auVar80._20_4_ = auVar133._20_4_ * 0.0;
            auVar80._24_4_ = auVar133._24_4_ * 0.0;
            auVar80._28_4_ = auVar133._28_4_;
            auVar121 = vfmsub231ps_fma(auVar80,auVar210,auVar125);
            auVar125 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar125,ZEXT1632(auVar20));
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar125,ZEXT1632(auVar13));
            auVar126 = vcmpps_avx(ZEXT1632(auVar20),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar125 = vblendvps_avx(ZEXT1632(auVar25),ZEXT1632(auVar7),auVar126);
            auVar133 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar8),auVar126);
            auVar132 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar9),auVar126);
            auVar147 = vblendvps_avx(auVar210,ZEXT1632(auVar11),auVar126);
            auVar221 = vblendvps_avx(ZEXT1632(auVar154),ZEXT1632(auVar12),auVar126);
            auVar22 = vblendvps_avx(auVar168,ZEXT1632(auVar21),auVar126);
            auVar210 = vblendvps_avx(ZEXT1632(auVar11),auVar210,auVar126);
            auVar23 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar154),auVar126);
            auVar20 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
            auVar168 = vblendvps_avx(ZEXT1632(auVar21),auVar168,auVar126);
            auVar210 = vsubps_avx(auVar210,auVar125);
            auVar23 = vsubps_avx(auVar23,auVar133);
            auVar142 = vsubps_avx(auVar168,auVar132);
            auVar164 = vsubps_avx(auVar125,auVar147);
            auVar197 = vsubps_avx(auVar133,auVar221);
            auVar199 = vsubps_avx(auVar132,auVar22);
            auVar190._0_4_ = auVar142._0_4_ * auVar125._0_4_;
            auVar190._4_4_ = auVar142._4_4_ * auVar125._4_4_;
            auVar190._8_4_ = auVar142._8_4_ * auVar125._8_4_;
            auVar190._12_4_ = auVar142._12_4_ * auVar125._12_4_;
            auVar190._16_4_ = auVar142._16_4_ * auVar125._16_4_;
            auVar190._20_4_ = auVar142._20_4_ * auVar125._20_4_;
            auVar190._24_4_ = auVar142._24_4_ * auVar125._24_4_;
            auVar190._28_4_ = 0;
            auVar21 = vfmsub231ps_fma(auVar190,auVar132,auVar210);
            auVar81._4_4_ = auVar210._4_4_ * auVar133._4_4_;
            auVar81._0_4_ = auVar210._0_4_ * auVar133._0_4_;
            auVar81._8_4_ = auVar210._8_4_ * auVar133._8_4_;
            auVar81._12_4_ = auVar210._12_4_ * auVar133._12_4_;
            auVar81._16_4_ = auVar210._16_4_ * auVar133._16_4_;
            auVar81._20_4_ = auVar210._20_4_ * auVar133._20_4_;
            auVar81._24_4_ = auVar210._24_4_ * auVar133._24_4_;
            auVar81._28_4_ = auVar168._28_4_;
            auVar7 = vfmsub231ps_fma(auVar81,auVar125,auVar23);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar21),_DAT_02020f00);
            auVar191._0_4_ = auVar23._0_4_ * auVar132._0_4_;
            auVar191._4_4_ = auVar23._4_4_ * auVar132._4_4_;
            auVar191._8_4_ = auVar23._8_4_ * auVar132._8_4_;
            auVar191._12_4_ = auVar23._12_4_ * auVar132._12_4_;
            auVar191._16_4_ = auVar23._16_4_ * auVar132._16_4_;
            auVar191._20_4_ = auVar23._20_4_ * auVar132._20_4_;
            auVar191._24_4_ = auVar23._24_4_ * auVar132._24_4_;
            auVar191._28_4_ = 0;
            auVar7 = vfmsub231ps_fma(auVar191,auVar133,auVar142);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
            auVar171 = ZEXT1664(auVar7);
            auVar192._0_4_ = auVar199._0_4_ * auVar147._0_4_;
            auVar192._4_4_ = auVar199._4_4_ * auVar147._4_4_;
            auVar192._8_4_ = auVar199._8_4_ * auVar147._8_4_;
            auVar192._12_4_ = auVar199._12_4_ * auVar147._12_4_;
            auVar192._16_4_ = auVar199._16_4_ * auVar147._16_4_;
            auVar192._20_4_ = auVar199._20_4_ * auVar147._20_4_;
            auVar192._24_4_ = auVar199._24_4_ * auVar147._24_4_;
            auVar192._28_4_ = 0;
            auVar21 = vfmsub231ps_fma(auVar192,auVar164,auVar22);
            auVar82._4_4_ = auVar197._4_4_ * auVar22._4_4_;
            auVar82._0_4_ = auVar197._0_4_ * auVar22._0_4_;
            auVar82._8_4_ = auVar197._8_4_ * auVar22._8_4_;
            auVar82._12_4_ = auVar197._12_4_ * auVar22._12_4_;
            auVar82._16_4_ = auVar197._16_4_ * auVar22._16_4_;
            auVar82._20_4_ = auVar197._20_4_ * auVar22._20_4_;
            auVar82._24_4_ = auVar197._24_4_ * auVar22._24_4_;
            auVar82._28_4_ = auVar22._28_4_;
            auVar8 = vfmsub231ps_fma(auVar82,auVar221,auVar199);
            auVar83._4_4_ = auVar164._4_4_ * auVar221._4_4_;
            auVar83._0_4_ = auVar164._0_4_ * auVar221._0_4_;
            auVar83._8_4_ = auVar164._8_4_ * auVar221._8_4_;
            auVar83._12_4_ = auVar164._12_4_ * auVar221._12_4_;
            auVar83._16_4_ = auVar164._16_4_ * auVar221._16_4_;
            auVar83._20_4_ = auVar164._20_4_ * auVar221._20_4_;
            auVar83._24_4_ = auVar164._24_4_ * auVar221._24_4_;
            auVar83._28_4_ = auVar221._28_4_;
            auVar9 = vfmsub231ps_fma(auVar83,auVar197,auVar147);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar147 = vmaxps_avx(ZEXT1632(auVar7),ZEXT1632(auVar8));
            auVar147 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,2);
            auVar21 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
            auVar20 = vpand_avx(auVar20,auVar21);
            auVar147 = vpmovsxwd_avx2(auVar20);
            if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar147 >> 0x7f,0) == '\0') &&
                  (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0xbf,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar147[0x1f]) {
LAB_019c8223:
              auVar179 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            }
            else {
              auVar84._4_4_ = auVar23._4_4_ * auVar199._4_4_;
              auVar84._0_4_ = auVar23._0_4_ * auVar199._0_4_;
              auVar84._8_4_ = auVar23._8_4_ * auVar199._8_4_;
              auVar84._12_4_ = auVar23._12_4_ * auVar199._12_4_;
              auVar84._16_4_ = auVar23._16_4_ * auVar199._16_4_;
              auVar84._20_4_ = auVar23._20_4_ * auVar199._20_4_;
              auVar84._24_4_ = auVar23._24_4_ * auVar199._24_4_;
              auVar84._28_4_ = auVar147._28_4_;
              auVar12 = vfmsub231ps_fma(auVar84,auVar197,auVar142);
              auVar194._0_4_ = auVar142._0_4_ * auVar164._0_4_;
              auVar194._4_4_ = auVar142._4_4_ * auVar164._4_4_;
              auVar194._8_4_ = auVar142._8_4_ * auVar164._8_4_;
              auVar194._12_4_ = auVar142._12_4_ * auVar164._12_4_;
              auVar194._16_4_ = auVar142._16_4_ * auVar164._16_4_;
              auVar194._20_4_ = auVar142._20_4_ * auVar164._20_4_;
              auVar194._24_4_ = auVar142._24_4_ * auVar164._24_4_;
              auVar194._28_4_ = 0;
              auVar11 = vfmsub231ps_fma(auVar194,auVar210,auVar199);
              auVar85._4_4_ = auVar210._4_4_ * auVar197._4_4_;
              auVar85._0_4_ = auVar210._0_4_ * auVar197._0_4_;
              auVar85._8_4_ = auVar210._8_4_ * auVar197._8_4_;
              auVar85._12_4_ = auVar210._12_4_ * auVar197._12_4_;
              auVar85._16_4_ = auVar210._16_4_ * auVar197._16_4_;
              auVar85._20_4_ = auVar210._20_4_ * auVar197._20_4_;
              auVar85._24_4_ = auVar210._24_4_ * auVar197._24_4_;
              auVar85._28_4_ = auVar197._28_4_;
              auVar13 = vfmsub231ps_fma(auVar85,auVar164,auVar23);
              auVar21 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar11),ZEXT1632(auVar13));
              auVar9 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar12),ZEXT832(0) << 0x20);
              auVar147 = vrcpps_avx(ZEXT1632(auVar9));
              auVar222._8_4_ = 0x3f800000;
              auVar222._0_8_ = &DAT_3f8000003f800000;
              auVar222._12_4_ = 0x3f800000;
              auVar222._16_4_ = 0x3f800000;
              auVar222._20_4_ = 0x3f800000;
              auVar222._24_4_ = 0x3f800000;
              auVar222._28_4_ = 0x3f800000;
              auVar21 = vfnmadd213ps_fma(auVar147,ZEXT1632(auVar9),auVar222);
              auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar147,auVar147);
              auVar177._0_4_ = auVar13._0_4_ * auVar132._0_4_;
              auVar177._4_4_ = auVar13._4_4_ * auVar132._4_4_;
              auVar177._8_4_ = auVar13._8_4_ * auVar132._8_4_;
              auVar177._12_4_ = auVar13._12_4_ * auVar132._12_4_;
              auVar177._16_4_ = auVar132._16_4_ * 0.0;
              auVar177._20_4_ = auVar132._20_4_ * 0.0;
              auVar177._24_4_ = auVar132._24_4_ * 0.0;
              auVar177._28_4_ = 0;
              auVar11 = vfmadd231ps_fma(auVar177,ZEXT1632(auVar11),auVar133);
              auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar125,ZEXT1632(auVar12));
              fVar153 = auVar21._0_4_;
              fVar152 = auVar21._4_4_;
              fVar135 = auVar21._8_4_;
              fVar136 = auVar21._12_4_;
              auVar132 = ZEXT1632(CONCAT412(fVar136 * auVar11._12_4_,
                                            CONCAT48(fVar135 * auVar11._8_4_,
                                                     CONCAT44(fVar152 * auVar11._4_4_,
                                                              fVar153 * auVar11._0_4_))));
              uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar178._4_4_ = uVar119;
              auVar178._0_4_ = uVar119;
              auVar178._8_4_ = uVar119;
              auVar178._12_4_ = uVar119;
              auVar178._16_4_ = uVar119;
              auVar178._20_4_ = uVar119;
              auVar178._24_4_ = uVar119;
              auVar178._28_4_ = uVar119;
              auVar105._4_4_ = uStack_13c;
              auVar105._0_4_ = local_140;
              auVar105._8_4_ = uStack_138;
              auVar105._12_4_ = uStack_134;
              auVar105._16_4_ = uStack_130;
              auVar105._20_4_ = uStack_12c;
              auVar105._24_4_ = uStack_128;
              auVar105._28_4_ = uStack_124;
              auVar125 = vcmpps_avx(auVar105,auVar132,2);
              auVar133 = vcmpps_avx(auVar132,auVar178,2);
              auVar125 = vandps_avx(auVar133,auVar125);
              auVar21 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
              auVar20 = vpand_avx(auVar20,auVar21);
              auVar125 = vpmovsxwd_avx2(auVar20);
              if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar125 >> 0x7f,0) == '\0') &&
                    (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar125 >> 0xbf,0) == '\0') &&
                  (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar125[0x1f]) goto LAB_019c8223;
              auVar125 = vcmpps_avx(ZEXT1632(auVar9),ZEXT832(0) << 0x20,4);
              auVar21 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
              auVar20 = vpand_avx(auVar20,auVar21);
              auVar125 = vpmovsxwd_avx2(auVar20);
              auVar179 = ZEXT3264(CONCAT824(uStack_5c8,
                                            CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
              if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar125 >> 0x7f,0) != '\0') ||
                    (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar125 >> 0xbf,0) != '\0') ||
                  (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar125[0x1f] < '\0') {
                auVar147 = ZEXT1632(CONCAT412(fVar136 * auVar7._12_4_,
                                              CONCAT48(fVar135 * auVar7._8_4_,
                                                       CONCAT44(fVar152 * auVar7._4_4_,
                                                                fVar153 * auVar7._0_4_))));
                auVar86._28_4_ = SUB84(uStack_5c8,4);
                auVar86._0_28_ =
                     ZEXT1628(CONCAT412(fVar136 * auVar8._12_4_,
                                        CONCAT48(fVar135 * auVar8._8_4_,
                                                 CONCAT44(fVar152 * auVar8._4_4_,
                                                          fVar153 * auVar8._0_4_))));
                auVar204._8_4_ = 0x3f800000;
                auVar204._0_8_ = &DAT_3f8000003f800000;
                auVar204._12_4_ = 0x3f800000;
                auVar204._16_4_ = 0x3f800000;
                auVar204._20_4_ = 0x3f800000;
                auVar204._24_4_ = 0x3f800000;
                auVar204._28_4_ = 0x3f800000;
                auVar133 = vsubps_avx(auVar204,auVar147);
                _local_320 = vblendvps_avx(auVar133,auVar147,auVar126);
                auVar133 = vsubps_avx(auVar204,auVar86);
                local_500 = vblendvps_avx(auVar133,auVar86,auVar126);
                auVar171 = ZEXT3264(local_500);
                auVar179 = ZEXT3264(auVar125);
                local_540 = auVar132;
              }
            }
            auVar213 = ZEXT3264(auVar201);
            auVar125 = auVar179._0_32_;
            local_580 = auVar187;
            local_560 = auVar149;
            if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar125 >> 0x7f,0) == '\0') &&
                  (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar125 >> 0xbf,0) == '\0') &&
                (auVar179 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar179[0x1f]) {
              auVar193 = ZEXT3264(local_6a0);
              auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,CONCAT416(
                                                  fVar218,CONCAT412(fVar218,CONCAT48(fVar218,
                                                  CONCAT44(fVar218,fVar218))))))));
            }
            else {
              auVar133 = vsubps_avx(auVar187,auVar149);
              auVar20 = vfmadd213ps_fma(auVar133,_local_320,auVar149);
              fVar153 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar87._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar153;
              auVar87._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar153;
              auVar87._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar153;
              auVar87._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar153;
              auVar87._16_4_ = fVar153 * 0.0;
              auVar87._20_4_ = fVar153 * 0.0;
              auVar87._24_4_ = fVar153 * 0.0;
              auVar87._28_4_ = fVar153;
              auVar133 = vcmpps_avx(local_540,auVar87,6);
              auVar132 = auVar125 & auVar133;
              auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,CONCAT416(
                                                  fVar218,CONCAT412(fVar218,CONCAT48(fVar218,
                                                  CONCAT44(fVar218,fVar218))))))));
              if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar132 >> 0x7f,0) == '\0') &&
                    (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar132 >> 0xbf,0) == '\0') &&
                  (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar132[0x1f]) {
                auVar193 = ZEXT3264(local_6a0);
              }
              else {
                local_3a0 = vandps_avx(auVar133,auVar125);
                auVar151._8_4_ = 0xbf800000;
                auVar151._0_8_ = 0xbf800000bf800000;
                auVar151._12_4_ = 0xbf800000;
                auVar151._16_4_ = 0xbf800000;
                auVar151._20_4_ = 0xbf800000;
                auVar151._24_4_ = 0xbf800000;
                auVar151._28_4_ = 0xbf800000;
                auVar169._8_4_ = 0x40000000;
                auVar169._0_8_ = 0x4000000040000000;
                auVar169._12_4_ = 0x40000000;
                auVar169._16_4_ = 0x40000000;
                auVar169._20_4_ = 0x40000000;
                auVar169._24_4_ = 0x40000000;
                auVar169._28_4_ = 0x40000000;
                auVar171 = ZEXT3264(auVar169);
                auVar20 = vfmadd213ps_fma(local_500,auVar169,auVar151);
                auVar179 = ZEXT1664(auVar20);
                local_460 = _local_320;
                local_440 = ZEXT1632(auVar20);
                local_3f0 = local_7d0;
                uStack_3e8 = uStack_7c8;
                local_3e0 = local_600._0_8_;
                uStack_3d8 = local_600._8_8_;
                local_3d0 = local_610._0_8_;
                uStack_3c8 = local_610._8_8_;
                local_3c0 = local_620;
                pGVar16 = (context->scene->geometries).items[uVar15].ptr;
                local_500 = local_440;
                if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  bVar118 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar118 = true, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar153 = (float)local_400;
                  auVar171 = ZEXT3264(CONCAT428(fVar153,CONCAT424(fVar153,CONCAT420(fVar153,
                                                  CONCAT416(fVar153,CONCAT412(fVar153,CONCAT48(
                                                  fVar153,CONCAT44(fVar153,fVar153))))))));
                  local_380[0] = (fVar153 + (float)local_320._0_4_ + 0.0) * local_1a0;
                  local_380[1] = (fVar153 + (float)local_320._4_4_ + 1.0) * fStack_19c;
                  local_380[2] = (fVar153 + fStack_318 + 2.0) * fStack_198;
                  local_380[3] = (fVar153 + fStack_314 + 3.0) * fStack_194;
                  fStack_370 = (fVar153 + fStack_310 + 4.0) * fStack_190;
                  fStack_36c = (fVar153 + fStack_30c + 5.0) * fStack_18c;
                  fStack_368 = (fVar153 + fStack_308 + 6.0) * fStack_188;
                  fStack_364 = fVar153 + fStack_304 + 7.0;
                  local_500._0_8_ = auVar20._0_8_;
                  local_500._8_8_ = auVar20._8_8_;
                  local_360 = local_500._0_8_;
                  uStack_358 = local_500._8_8_;
                  uStack_350 = 0;
                  uStack_348 = 0;
                  local_340 = local_540;
                  uVar112 = vmovmskps_avx(local_3a0);
                  bVar118 = uVar112 != 0;
                  if (bVar118) {
                    local_960 = 0;
                    local_940 = (ulong)(uVar112 & 0xff);
                    for (uVar111 = local_940; (uVar111 & 1) == 0;
                        uVar111 = uVar111 >> 1 | 0x8000000000000000) {
                      local_960 = local_960 + 1;
                    }
                    local_6c0 = ZEXT1632(local_600);
                    auStack_750 = auVar203._16_16_;
                    local_760 = local_610;
                    _local_6e0 = ZEXT1632(local_620);
                    local_420 = local_540;
                    local_3fc = iVar110;
                    do {
                      local_720._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                      fVar153 = local_380[local_960];
                      auVar124._4_4_ = fVar153;
                      auVar124._0_4_ = fVar153;
                      auVar124._8_4_ = fVar153;
                      auVar124._12_4_ = fVar153;
                      local_260._16_4_ = fVar153;
                      local_260._0_16_ = auVar124;
                      local_260._20_4_ = fVar153;
                      local_260._24_4_ = fVar153;
                      local_260._28_4_ = fVar153;
                      local_240._4_4_ = *(undefined4 *)((long)&local_360 + local_960 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_340 + local_960 * 4);
                      fVar152 = 1.0 - fVar153;
                      auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar124,
                                                ZEXT416(0xc0a00000));
                      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153 * 3.0)),
                                                ZEXT416((uint)(fVar153 + fVar153)),auVar20);
                      auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar124,
                                                ZEXT416(0x40000000));
                      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152 * -3.0)),
                                                ZEXT416((uint)(fVar152 + fVar152)),auVar20);
                      auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar153 * (fVar152 + fVar152))),
                                                ZEXT416((uint)fVar152),ZEXT416((uint)fVar152));
                      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153)),auVar124,
                                               ZEXT416((uint)(fVar152 * -2.0)));
                      fVar153 = auVar20._0_4_ * 0.5;
                      fVar152 = auVar7._0_4_ * 0.5;
                      auVar184._0_4_ = fVar152 * (float)local_6e0._0_4_;
                      auVar184._4_4_ = fVar152 * (float)local_6e0._4_4_;
                      auVar184._8_4_ = fVar152 * fStack_6d8;
                      auVar184._12_4_ = fVar152 * fStack_6d4;
                      auVar160._4_4_ = fVar153;
                      auVar160._0_4_ = fVar153;
                      auVar160._8_4_ = fVar153;
                      auVar160._12_4_ = fVar153;
                      auVar20 = vfmadd132ps_fma(auVar160,auVar184,local_760);
                      fVar153 = auVar21._0_4_ * 0.5;
                      auVar185._4_4_ = fVar153;
                      auVar185._0_4_ = fVar153;
                      auVar185._8_4_ = fVar153;
                      auVar185._12_4_ = fVar153;
                      auVar20 = vfmadd132ps_fma(auVar185,auVar20,local_6c0._0_16_);
                      local_7b0.context = context->user;
                      fVar153 = auVar8._0_4_ * 0.5;
                      auVar161._4_4_ = fVar153;
                      auVar161._0_4_ = fVar153;
                      auVar161._8_4_ = fVar153;
                      auVar161._12_4_ = fVar153;
                      auVar21 = vfmadd132ps_fma(auVar161,auVar20,auVar10);
                      local_2c0 = auVar21._0_4_;
                      uStack_2bc = local_2c0;
                      uStack_2b8 = local_2c0;
                      uStack_2b4 = local_2c0;
                      uStack_2b0 = local_2c0;
                      uStack_2ac = local_2c0;
                      uStack_2a8 = local_2c0;
                      uStack_2a4 = local_2c0;
                      auVar20 = vmovshdup_avx(auVar21);
                      auVar174._0_8_ = auVar20._0_8_;
                      auVar174._8_8_ = auVar174._0_8_;
                      local_2a0._16_8_ = auVar174._0_8_;
                      local_2a0._0_16_ = auVar174;
                      local_2a0._24_8_ = auVar174._0_8_;
                      auVar179 = ZEXT3264(local_2a0);
                      auVar20 = vshufps_avx(auVar21,auVar21,0xaa);
                      auVar162._0_8_ = auVar20._0_8_;
                      auVar162._8_8_ = auVar162._0_8_;
                      local_280._16_8_ = auVar162._0_8_;
                      local_280._0_16_ = auVar162;
                      local_280._24_8_ = auVar162._0_8_;
                      auVar171 = ZEXT3264(local_280);
                      local_240._0_4_ = local_240._4_4_;
                      local_240._8_4_ = local_240._4_4_;
                      local_240._12_4_ = local_240._4_4_;
                      local_240._16_4_ = local_240._4_4_;
                      local_240._20_4_ = local_240._4_4_;
                      local_240._24_4_ = local_240._4_4_;
                      local_240._28_4_ = local_240._4_4_;
                      local_220 = CONCAT44(uStack_17c,local_180);
                      uStack_218 = CONCAT44(uStack_174,uStack_178);
                      uStack_210 = CONCAT44(uStack_16c,uStack_170);
                      uStack_208 = CONCAT44(uStack_164,uStack_168);
                      local_200._4_4_ = uStack_15c;
                      local_200._0_4_ = local_160;
                      local_200._8_4_ = uStack_158;
                      local_200._12_4_ = uStack_154;
                      local_200._16_4_ = uStack_150;
                      local_200._20_4_ = uStack_14c;
                      local_200._24_4_ = uStack_148;
                      local_200._28_4_ = uStack_144;
                      vpcmpeqd_avx2(local_200,local_200);
                      local_1e0 = (local_7b0.context)->instID[0];
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = (local_7b0.context)->instPrimID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_640 = local_300._0_8_;
                      uStack_638 = local_300._8_8_;
                      uStack_630 = local_300._16_8_;
                      uStack_628 = local_300._24_8_;
                      local_7b0.valid = (int *)&local_640;
                      local_7b0.geometryUserPtr = pGVar16->userPtr;
                      local_7b0.hit = (RTCHitN *)&local_2c0;
                      local_7b0.N = 8;
                      local_7b0.ray = (RTCRayN *)ray;
                      if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar171 = ZEXT1664(auVar162);
                        auVar179 = ZEXT1664(auVar174);
                        (*pGVar16->occlusionFilterN)(&local_7b0);
                      }
                      auVar103._8_8_ = uStack_638;
                      auVar103._0_8_ = local_640;
                      auVar103._16_8_ = uStack_630;
                      auVar103._24_8_ = uStack_628;
                      auVar133 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar103);
                      auVar125 = _DAT_0205a980 & ~auVar133;
                      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar125 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar125 >> 0x7f,0) == '\0') &&
                            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar125 >> 0xbf,0) == '\0') &&
                          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar125[0x1f]) {
                        auVar133 = auVar133 ^ _DAT_0205a980;
                      }
                      else {
                        p_Var19 = context->args->filter;
                        if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar179 = ZEXT1664(auVar179._0_16_);
                          (*p_Var19)(&local_7b0);
                        }
                        auVar104._8_8_ = uStack_638;
                        auVar104._0_8_ = local_640;
                        auVar104._16_8_ = uStack_630;
                        auVar104._24_8_ = uStack_628;
                        auVar125 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar104
                                                );
                        auVar133 = auVar125 ^ _DAT_0205a980;
                        auVar170._8_4_ = 0xff800000;
                        auVar170._0_8_ = 0xff800000ff800000;
                        auVar170._12_4_ = 0xff800000;
                        auVar170._16_4_ = 0xff800000;
                        auVar170._20_4_ = 0xff800000;
                        auVar170._24_4_ = 0xff800000;
                        auVar170._28_4_ = 0xff800000;
                        auVar171 = ZEXT3264(auVar170);
                        auVar125 = vblendvps_avx(auVar170,*(undefined1 (*) [32])
                                                           (local_7b0.ray + 0x100),auVar125);
                        *(undefined1 (*) [32])(local_7b0.ray + 0x100) = auVar125;
                      }
                      if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar133 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar133 >> 0x7f,0) != '\0') ||
                            (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar133 >> 0xbf,0) != '\0') ||
                          (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar133[0x1f] < '\0') break;
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_720._0_4_;
                      uVar111 = local_960 & 0x3f;
                      local_960 = 0;
                      local_940 = local_940 ^ 1L << uVar111;
                      for (uVar111 = local_940; (uVar111 & 1) == 0;
                          uVar111 = uVar111 >> 1 | 0x8000000000000000) {
                        local_960 = local_960 + 1;
                      }
                      bVar118 = local_940 != 0;
                    } while (bVar118);
                  }
                  auVar198 = ZEXT3264(CONCAT428(fVar218,CONCAT424(fVar218,CONCAT420(fVar218,
                                                  CONCAT416(fVar218,CONCAT412(fVar218,CONCAT48(
                                                  fVar218,CONCAT44(fVar218,fVar218))))))));
                }
                auVar213 = ZEXT3264(auVar201);
                bVar117 = (bool)(bVar117 | bVar118);
                auVar193 = ZEXT3264(local_6a0);
              }
            }
          }
          lVar116 = lVar116 + 8;
        } while ((int)lVar116 < iVar110);
      }
      if (bVar117) {
        return local_96d;
      }
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar134._4_4_ = uVar119;
      auVar134._0_4_ = uVar119;
      auVar134._8_4_ = uVar119;
      auVar134._12_4_ = uVar119;
      auVar134._16_4_ = uVar119;
      auVar134._20_4_ = uVar119;
      auVar134._24_4_ = uVar119;
      auVar134._28_4_ = uVar119;
      auVar125 = vcmpps_avx(local_80,auVar134,2);
      uVar112 = vmovmskps_avx(auVar125);
      uVar109 = uVar109 & uVar109 + 0xff & uVar112;
      local_96d = uVar109 != 0;
    } while (local_96d);
  }
  return local_96d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }